

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx2::CurveNiIntersector1<4>::
     occluded_t<embree::avx2::SweepCurve1Intersector1<embree::BezierCurveT>,embree::avx2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  int iVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [12];
  ulong uVar48;
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  byte bVar55;
  uint uVar56;
  uint uVar57;
  ulong uVar58;
  long lVar59;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  uint uVar60;
  ulong uVar61;
  undefined4 uVar62;
  undefined8 in_R9;
  byte bVar63;
  ulong uVar64;
  bool bVar65;
  undefined8 uVar66;
  vint4 bi_2;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar72 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar92;
  float fVar120;
  float fVar121;
  vint4 bi_1;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar123;
  float fVar124;
  float fVar125;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  float fVar122;
  float fVar126;
  float fVar127;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar144;
  float fVar145;
  float fVar146;
  undefined1 auVar133 [32];
  float fVar143;
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  vint4 ai_2;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar168;
  float fVar169;
  float fVar170;
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  vint4 ai;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar188;
  float fVar202;
  float fVar203;
  vint4 bi;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  vint4 ai_1;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [64];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [64];
  undefined1 auVar234 [32];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  float fVar247;
  undefined1 auVar248 [32];
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar254;
  float fVar255;
  undefined1 auVar249 [64];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [32];
  undefined1 auVar259 [64];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [64];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_b04;
  undefined1 local_b00 [8];
  float fStack_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  float fStack_ae8;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  int local_a64;
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [16];
  undefined1 local_9f0 [8];
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [16];
  RTCFilterFunctionNArguments local_9b0;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined8 local_940;
  undefined4 local_938;
  float local_934;
  undefined4 local_930;
  undefined4 local_92c;
  uint local_928;
  uint local_924;
  uint local_920;
  ulong local_908;
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  undefined1 auStack_7d0 [16];
  undefined1 local_7c0 [16];
  ulong local_7b0;
  ulong local_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [32];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  float fStack_3e4;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  float fStack_3c4;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar228 [32];
  
  PVar3 = prim[1];
  uVar58 = (ulong)(byte)PVar3;
  auVar9 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                      *(undefined1 (*) [16])(prim + uVar58 * 0x19 + 6));
  fVar92 = *(float *)(prim + uVar58 * 0x19 + 0x12);
  auVar67._0_4_ = fVar92 * auVar9._0_4_;
  auVar67._4_4_ = fVar92 * auVar9._4_4_;
  auVar67._8_4_ = fVar92 * auVar9._8_4_;
  auVar67._12_4_ = fVar92 * auVar9._12_4_;
  auVar189._0_4_ = fVar92 * (ray->dir).field_0.m128[0];
  auVar189._4_4_ = fVar92 * (ray->dir).field_0.m128[1];
  auVar189._8_4_ = fVar92 * (ray->dir).field_0.m128[2];
  auVar189._12_4_ = fVar92 * (ray->dir).field_0.m128[3];
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 4 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar6 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 5 + 6)));
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 6 + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0xb + 6)));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar195 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0xc + 6)));
  auVar195 = vcvtdq2ps_avx(auVar195);
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0xd + 6)));
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0x12 + 6)));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0x13 + 6)));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar242 = ZEXT1664(auVar69);
  auVar129 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0x14 + 6)));
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar256._4_4_ = auVar189._0_4_;
  auVar256._0_4_ = auVar189._0_4_;
  auVar256._8_4_ = auVar189._0_4_;
  auVar256._12_4_ = auVar189._0_4_;
  auVar94 = vshufps_avx(auVar189,auVar189,0x55);
  auVar68 = vshufps_avx(auVar189,auVar189,0xaa);
  fVar92 = auVar68._0_4_;
  auVar231._0_4_ = fVar92 * auVar7._0_4_;
  fVar120 = auVar68._4_4_;
  auVar231._4_4_ = fVar120 * auVar7._4_4_;
  fVar121 = auVar68._8_4_;
  auVar231._8_4_ = fVar121 * auVar7._8_4_;
  fVar122 = auVar68._12_4_;
  auVar231._12_4_ = fVar122 * auVar7._12_4_;
  auVar225._0_4_ = auVar78._0_4_ * fVar92;
  auVar225._4_4_ = auVar78._4_4_ * fVar120;
  auVar225._8_4_ = auVar78._8_4_ * fVar121;
  auVar225._12_4_ = auVar78._12_4_ * fVar122;
  auVar217._0_4_ = auVar129._0_4_ * fVar92;
  auVar217._4_4_ = auVar129._4_4_ * fVar120;
  auVar217._8_4_ = auVar129._8_4_ * fVar121;
  auVar217._12_4_ = auVar129._12_4_ * fVar122;
  auVar68 = vfmadd231ps_fma(auVar231,auVar94,auVar6);
  auVar95 = vfmadd231ps_fma(auVar225,auVar94,auVar195);
  auVar94 = vfmadd231ps_fma(auVar217,auVar69,auVar94);
  auVar147 = vfmadd231ps_fma(auVar68,auVar256,auVar9);
  auVar95 = vfmadd231ps_fma(auVar95,auVar256,auVar74);
  auVar172 = vfmadd231ps_fma(auVar94,auVar70,auVar256);
  auVar257._4_4_ = auVar67._0_4_;
  auVar257._0_4_ = auVar67._0_4_;
  auVar257._8_4_ = auVar67._0_4_;
  auVar257._12_4_ = auVar67._0_4_;
  auVar94 = vshufps_avx(auVar67,auVar67,0x55);
  auVar68 = vshufps_avx(auVar67,auVar67,0xaa);
  fVar92 = auVar68._0_4_;
  auVar190._0_4_ = fVar92 * auVar7._0_4_;
  fVar120 = auVar68._4_4_;
  auVar190._4_4_ = fVar120 * auVar7._4_4_;
  fVar121 = auVar68._8_4_;
  auVar190._8_4_ = fVar121 * auVar7._8_4_;
  fVar122 = auVar68._12_4_;
  auVar190._12_4_ = fVar122 * auVar7._12_4_;
  auVar93._0_4_ = auVar78._0_4_ * fVar92;
  auVar93._4_4_ = auVar78._4_4_ * fVar120;
  auVar93._8_4_ = auVar78._8_4_ * fVar121;
  auVar93._12_4_ = auVar78._12_4_ * fVar122;
  auVar68._0_4_ = auVar129._0_4_ * fVar92;
  auVar68._4_4_ = auVar129._4_4_ * fVar120;
  auVar68._8_4_ = auVar129._8_4_ * fVar121;
  auVar68._12_4_ = auVar129._12_4_ * fVar122;
  auVar6 = vfmadd231ps_fma(auVar190,auVar94,auVar6);
  auVar7 = vfmadd231ps_fma(auVar93,auVar94,auVar195);
  auVar195 = vfmadd231ps_fma(auVar68,auVar94,auVar69);
  auVar78 = vfmadd231ps_fma(auVar6,auVar257,auVar9);
  auVar69 = vfmadd231ps_fma(auVar7,auVar257,auVar74);
  local_a00._8_4_ = 0x7fffffff;
  local_a00._0_8_ = 0x7fffffff7fffffff;
  local_a00._12_4_ = 0x7fffffff;
  auVar129 = vfmadd231ps_fma(auVar195,auVar257,auVar70);
  auVar9 = vandps_avx(auVar147,local_a00);
  auVar171._8_4_ = 0x219392ef;
  auVar171._0_8_ = 0x219392ef219392ef;
  auVar171._12_4_ = 0x219392ef;
  auVar9 = vcmpps_avx(auVar9,auVar171,1);
  auVar6 = vblendvps_avx(auVar147,auVar171,auVar9);
  auVar9 = vandps_avx(auVar95,local_a00);
  auVar9 = vcmpps_avx(auVar9,auVar171,1);
  auVar7 = vblendvps_avx(auVar95,auVar171,auVar9);
  auVar9 = vandps_avx(local_a00,auVar172);
  auVar9 = vcmpps_avx(auVar9,auVar171,1);
  auVar9 = vblendvps_avx(auVar172,auVar171,auVar9);
  auVar74 = vrcpps_avx(auVar6);
  auVar218._8_4_ = 0x3f800000;
  auVar218._0_8_ = 0x3f8000003f800000;
  auVar218._12_4_ = 0x3f800000;
  auVar6 = vfnmadd213ps_fma(auVar6,auVar74,auVar218);
  auVar74 = vfmadd132ps_fma(auVar6,auVar74,auVar74);
  auVar6 = vrcpps_avx(auVar7);
  auVar7 = vfnmadd213ps_fma(auVar7,auVar6,auVar218);
  auVar195 = vfmadd132ps_fma(auVar7,auVar6,auVar6);
  auVar6 = vrcpps_avx(auVar9);
  auVar9 = vfnmadd213ps_fma(auVar9,auVar6,auVar218);
  auVar70 = vfmadd132ps_fma(auVar9,auVar6,auVar6);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar58 * 7 + 6);
  auVar9 = vpmovsxwd_avx(auVar9);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar7 = vsubps_avx(auVar9,auVar78);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar58 * 9 + 6);
  auVar9 = vpmovsxwd_avx(auVar6);
  auVar172._0_4_ = auVar74._0_4_ * auVar7._0_4_;
  auVar172._4_4_ = auVar74._4_4_ * auVar7._4_4_;
  auVar172._8_4_ = auVar74._8_4_ * auVar7._8_4_;
  auVar172._12_4_ = auVar74._12_4_ * auVar7._12_4_;
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar78);
  auVar191._0_4_ = auVar74._0_4_ * auVar9._0_4_;
  auVar191._4_4_ = auVar74._4_4_ * auVar9._4_4_;
  auVar191._8_4_ = auVar74._8_4_ * auVar9._8_4_;
  auVar191._12_4_ = auVar74._12_4_ * auVar9._12_4_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar58 * 0xe + 6);
  auVar9 = vpmovsxwd_avx(auVar7);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar6 = vsubps_avx(auVar9,auVar69);
  auVar95._1_3_ = 0;
  auVar95[0] = PVar3;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar9 = vpmovsxwd_avx(auVar74);
  auVar208._0_4_ = auVar195._0_4_ * auVar6._0_4_;
  auVar208._4_4_ = auVar195._4_4_ * auVar6._4_4_;
  auVar208._8_4_ = auVar195._8_4_ * auVar6._8_4_;
  auVar208._12_4_ = auVar195._12_4_ * auVar6._12_4_;
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar69);
  auVar94._0_4_ = auVar195._0_4_ * auVar9._0_4_;
  auVar94._4_4_ = auVar195._4_4_ * auVar9._4_4_;
  auVar94._8_4_ = auVar195._8_4_ * auVar9._8_4_;
  auVar94._12_4_ = auVar195._12_4_ * auVar9._12_4_;
  auVar195._8_8_ = 0;
  auVar195._0_8_ = *(ulong *)(prim + uVar58 * 0x15 + 6);
  auVar9 = vpmovsxwd_avx(auVar195);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar129);
  auVar147._0_4_ = auVar70._0_4_ * auVar9._0_4_;
  auVar147._4_4_ = auVar70._4_4_ * auVar9._4_4_;
  auVar147._8_4_ = auVar70._8_4_ * auVar9._8_4_;
  auVar147._12_4_ = auVar70._12_4_ * auVar9._12_4_;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar58 * 0x17 + 6);
  auVar9 = vpmovsxwd_avx(auVar78);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar129);
  auVar69._0_4_ = auVar70._0_4_ * auVar9._0_4_;
  auVar69._4_4_ = auVar70._4_4_ * auVar9._4_4_;
  auVar69._8_4_ = auVar70._8_4_ * auVar9._8_4_;
  auVar69._12_4_ = auVar70._12_4_ * auVar9._12_4_;
  auVar9 = vpminsd_avx(auVar172,auVar191);
  auVar6 = vpminsd_avx(auVar208,auVar94);
  auVar9 = vmaxps_avx(auVar9,auVar6);
  auVar6 = vpminsd_avx(auVar147,auVar69);
  uVar62 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar226._4_4_ = uVar62;
  auVar226._0_4_ = uVar62;
  auVar226._8_4_ = uVar62;
  auVar226._12_4_ = uVar62;
  auVar6 = vmaxps_avx(auVar6,auVar226);
  auVar9 = vmaxps_avx(auVar9,auVar6);
  local_520._0_4_ = auVar9._0_4_ * 0.99999964;
  local_520._4_4_ = auVar9._4_4_ * 0.99999964;
  local_520._8_4_ = auVar9._8_4_ * 0.99999964;
  local_520._12_4_ = auVar9._12_4_ * 0.99999964;
  auVar9 = vpmaxsd_avx(auVar172,auVar191);
  auVar6 = vpmaxsd_avx(auVar208,auVar94);
  auVar9 = vminps_avx(auVar9,auVar6);
  auVar6 = vpmaxsd_avx(auVar147,auVar69);
  fVar92 = ray->tfar;
  auVar129._4_4_ = fVar92;
  auVar129._0_4_ = fVar92;
  auVar129._8_4_ = fVar92;
  auVar129._12_4_ = fVar92;
  auVar6 = vminps_avx(auVar6,auVar129);
  auVar9 = vminps_avx(auVar9,auVar6);
  auVar70._0_4_ = auVar9._0_4_ * 1.0000004;
  auVar70._4_4_ = auVar9._4_4_ * 1.0000004;
  auVar70._8_4_ = auVar9._8_4_ * 1.0000004;
  auVar70._12_4_ = auVar9._12_4_ * 1.0000004;
  auVar95[4] = PVar3;
  auVar95._5_3_ = 0;
  auVar95[8] = PVar3;
  auVar95._9_3_ = 0;
  auVar95[0xc] = PVar3;
  auVar95._13_3_ = 0;
  auVar6 = vpcmpgtd_avx(auVar95,_DAT_01f4ad30);
  auVar9 = vcmpps_avx(local_520,auVar70,2);
  auVar9 = vandps_avx(auVar9,auVar6);
  auVar108._16_16_ = mm_lookupmask_ps._240_16_;
  auVar108._0_16_ = mm_lookupmask_ps._240_16_;
  uVar62 = vmovmskps_avx(auVar9);
  local_7a8 = CONCAT44((int)((ulong)in_R9 >> 0x20),uVar62);
  local_340 = vblendps_avx(auVar108,ZEXT832(0) << 0x20,0x80);
LAB_0118fc85:
  if (local_7a8 == 0) {
LAB_0119213c:
    return local_7a8 != 0;
  }
  lVar59 = 0;
  for (uVar58 = local_7a8; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
    lVar59 = lVar59 + 1;
  }
  uVar57 = *(uint *)(prim + 2);
  local_908 = (ulong)*(uint *)(prim + lVar59 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[uVar57].ptr;
  uVar58 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_908);
  p_Var5 = pGVar4[1].intersectionFilterN;
  lVar59 = *(long *)&pGVar4[1].time_range.upper;
  auVar9 = *(undefined1 (*) [16])(lVar59 + (long)p_Var5 * uVar58);
  auVar6 = *(undefined1 (*) [16])(lVar59 + (uVar58 + 1) * (long)p_Var5);
  auVar7 = *(undefined1 (*) [16])(lVar59 + (uVar58 + 2) * (long)p_Var5);
  local_7b0 = local_7a8 - 1 & local_7a8;
  auVar74 = *(undefined1 (*) [16])(lVar59 + (uVar58 + 3) * (long)p_Var5);
  if (local_7b0 != 0) {
    uVar61 = local_7b0 - 1 & local_7b0;
    for (uVar58 = local_7b0; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
    }
    if (uVar61 != 0) {
      for (; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar192._0_4_ = (auVar9._0_4_ + auVar6._0_4_ + auVar7._0_4_ + auVar74._0_4_) * 0.25;
  auVar192._4_4_ = (auVar9._4_4_ + auVar6._4_4_ + auVar7._4_4_ + auVar74._4_4_) * 0.25;
  auVar192._8_4_ = (auVar9._8_4_ + auVar6._8_4_ + auVar7._8_4_ + auVar74._8_4_) * 0.25;
  auVar192._12_4_ = (auVar9._12_4_ + auVar6._12_4_ + auVar7._12_4_ + auVar74._12_4_) * 0.25;
  aVar1 = (ray->org).field_0;
  aVar2 = (ray->dir).field_0.field_1;
  auVar195 = vsubps_avx(auVar192,(undefined1  [16])aVar1);
  auVar195 = vdpps_avx(auVar195,(undefined1  [16])aVar2,0x7f);
  auVar78 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  auVar70 = vrcpss_avx(auVar78,auVar78);
  auVar78 = vfnmadd213ss_fma(auVar70,auVar78,ZEXT416(0x40000000));
  fVar92 = auVar195._0_4_ * auVar70._0_4_ * auVar78._0_4_;
  local_7c0 = ZEXT416((uint)fVar92);
  auVar193._4_4_ = fVar92;
  auVar193._0_4_ = fVar92;
  auVar193._8_4_ = fVar92;
  auVar193._12_4_ = fVar92;
  fStack_650 = fVar92;
  _local_660 = auVar193;
  fStack_64c = fVar92;
  fStack_648 = fVar92;
  fStack_644 = fVar92;
  auVar195 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar193);
  auVar195 = vblendps_avx(auVar195,_DAT_01f45a50,8);
  local_9c0 = vsubps_avx(auVar9,auVar195);
  local_9d0 = vsubps_avx(auVar7,auVar195);
  local_9e0 = vsubps_avx(auVar6,auVar195);
  _local_9f0 = vsubps_avx(auVar74,auVar195);
  auVar9 = vmovshdup_avx(local_9c0);
  local_1e0 = auVar9._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar9 = vshufps_avx(local_9c0,local_9c0,0xaa);
  uVar66 = auVar9._0_8_;
  auVar219._8_8_ = uVar66;
  auVar219._0_8_ = uVar66;
  auVar219._16_8_ = uVar66;
  auVar219._24_8_ = uVar66;
  auVar9 = vshufps_avx(local_9c0,local_9c0,0xff);
  uVar66 = auVar9._0_8_;
  local_8c0._8_8_ = uVar66;
  local_8c0._0_8_ = uVar66;
  local_8c0._16_8_ = uVar66;
  local_8c0._24_8_ = uVar66;
  auVar224 = ZEXT3264(local_8c0);
  auVar9 = vmovshdup_avx(local_9e0);
  local_200 = auVar9._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar9 = vshufps_avx(local_9e0,local_9e0,0xaa);
  uVar66 = auVar9._0_8_;
  local_8e0._8_8_ = uVar66;
  local_8e0._0_8_ = uVar66;
  local_8e0._16_8_ = uVar66;
  local_8e0._24_8_ = uVar66;
  auVar249 = ZEXT3264(local_8e0);
  auVar9 = vshufps_avx(local_9e0,local_9e0,0xff);
  uVar66 = auVar9._0_8_;
  local_840._8_8_ = uVar66;
  local_840._0_8_ = uVar66;
  local_840._16_8_ = uVar66;
  local_840._24_8_ = uVar66;
  auVar259 = ZEXT3264(local_840);
  auVar9 = vmovshdup_avx(local_9d0);
  uVar66 = auVar9._0_8_;
  local_a20._8_8_ = uVar66;
  local_a20._0_8_ = uVar66;
  local_a20._16_8_ = uVar66;
  local_a20._24_8_ = uVar66;
  auVar265 = ZEXT3264(local_a20);
  auVar6 = vshufps_avx(local_9d0,local_9d0,0xaa);
  uVar66 = auVar6._0_8_;
  auVar228._8_8_ = uVar66;
  auVar228._0_8_ = uVar66;
  auVar228._16_8_ = uVar66;
  auVar228._24_8_ = uVar66;
  auVar230 = ZEXT3264(auVar228);
  auVar9 = vshufps_avx(local_9d0,local_9d0,0xff);
  local_440 = auVar9._0_4_;
  fStack_43c = auVar9._4_4_;
  auVar9 = vmovshdup_avx(_local_9f0);
  local_220 = auVar9._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar9 = vshufps_avx(_local_9f0,_local_9f0,0xaa);
  local_240 = auVar9._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar9 = vshufps_avx(_local_9f0,_local_9f0,0xff);
  local_260 = auVar9._0_8_;
  uStack_258 = local_260;
  uStack_250 = local_260;
  uStack_248 = local_260;
  auVar71._0_4_ = aVar2.x * aVar2.x;
  auVar71._4_4_ = aVar2.y * aVar2.y;
  auVar71._8_4_ = aVar2.z * aVar2.z;
  auVar71._12_4_ = aVar2.field_3.w * aVar2.field_3.w;
  auVar9 = vshufps_avx(auVar71,auVar71,0xaa);
  uVar66 = auVar9._0_8_;
  auVar233._8_8_ = uVar66;
  auVar233._0_8_ = uVar66;
  auVar233._16_8_ = uVar66;
  auVar233._24_8_ = uVar66;
  uVar62 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
  local_540._4_4_ = uVar62;
  local_540._0_4_ = uVar62;
  local_540._8_4_ = uVar62;
  local_540._12_4_ = uVar62;
  local_540._16_4_ = uVar62;
  local_540._20_4_ = uVar62;
  local_540._24_4_ = uVar62;
  local_540._28_4_ = uVar62;
  auVar9 = vfmadd231ps_fma(auVar233,local_540,local_540);
  uVar62 = *(undefined4 *)&(ray->dir).field_0;
  local_560._4_4_ = uVar62;
  local_560._0_4_ = uVar62;
  fStack_558 = (float)uVar62;
  fStack_554 = (float)uVar62;
  fStack_550 = (float)uVar62;
  fStack_54c = (float)uVar62;
  fStack_548 = (float)uVar62;
  register0x0000121c = uVar62;
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),_local_560,_local_560);
  auVar240 = ZEXT1664(auVar9);
  uVar58 = 0;
  bVar63 = 0;
  local_b04 = 1;
  local_680 = (ray->dir).field_0.m128[2];
  uVar62 = local_9c0._0_4_;
  local_380._4_4_ = uVar62;
  local_380._0_4_ = uVar62;
  local_380._8_4_ = uVar62;
  local_380._12_4_ = uVar62;
  local_380._16_4_ = uVar62;
  local_380._20_4_ = uVar62;
  local_380._24_4_ = uVar62;
  local_380._28_4_ = uVar62;
  uVar62 = local_9e0._0_4_;
  local_3a0._4_4_ = uVar62;
  local_3a0._0_4_ = uVar62;
  local_3a0._8_4_ = uVar62;
  local_3a0._12_4_ = uVar62;
  local_3a0._16_4_ = uVar62;
  local_3a0._20_4_ = uVar62;
  local_3a0._24_4_ = uVar62;
  local_3a0._28_4_ = uVar62;
  local_460 = local_9d0._0_4_;
  fStack_45c = local_460;
  fStack_458 = local_460;
  fStack_454 = local_460;
  fStack_450 = local_460;
  fStack_44c = local_460;
  fStack_448 = local_460;
  fStack_444 = local_460;
  local_3c0 = local_9f0._0_4_;
  local_6a0._8_4_ = 0x7fffffff;
  local_6a0._0_8_ = 0x7fffffff7fffffff;
  local_6a0._12_4_ = 0x7fffffff;
  local_6a0._16_4_ = 0x7fffffff;
  local_6a0._20_4_ = 0x7fffffff;
  local_6a0._24_4_ = 0x7fffffff;
  local_6a0._28_4_ = 0x7fffffff;
  local_280 = ZEXT1632(auVar9);
  local_480 = vandps_avx(ZEXT1632(auVar9),local_6a0);
  local_510 = ZEXT816(0x3f80000000000000);
  local_360 = auVar219;
  fStack_3bc = local_3c0;
  fStack_3b8 = local_3c0;
  fStack_3b4 = local_3c0;
  fStack_3b0 = local_3c0;
  fStack_3ac = local_3c0;
  fStack_3a8 = local_3c0;
  fStack_3a4 = local_3c0;
  fStack_67c = local_680;
  fStack_678 = local_680;
  fStack_674 = local_680;
  fStack_670 = local_680;
  fStack_66c = local_680;
  fStack_668 = local_680;
  fStack_664 = local_680;
  fStack_438 = local_440;
  fStack_434 = fStack_43c;
  fStack_430 = local_440;
  fStack_42c = fStack_43c;
  fStack_428 = local_440;
  fStack_424 = fStack_43c;
  do {
    auVar9 = vmovshdup_avx(local_510);
    auVar9 = vsubps_avx(auVar9,local_510);
    fVar123 = auVar9._0_4_;
    fVar125 = fVar123 * 0.04761905;
    local_900._0_4_ = local_510._0_4_;
    local_900._4_4_ = local_900._0_4_;
    local_900._8_4_ = local_900._0_4_;
    local_900._12_4_ = local_900._0_4_;
    local_900._16_4_ = local_900._0_4_;
    local_900._20_4_ = local_900._0_4_;
    local_900._24_4_ = local_900._0_4_;
    local_900._28_4_ = local_900._0_4_;
    local_6e0._4_4_ = fVar123;
    local_6e0._0_4_ = fVar123;
    local_6e0._8_4_ = fVar123;
    local_6e0._12_4_ = fVar123;
    local_6e0._16_4_ = fVar123;
    local_6e0._20_4_ = fVar123;
    local_6e0._24_4_ = fVar123;
    local_6e0._28_4_ = fVar123;
    auVar9 = vfmadd231ps_fma(local_900,local_6e0,_DAT_01f7b040);
    auVar109._8_4_ = 0x3f800000;
    auVar109._0_8_ = 0x3f8000003f800000;
    auVar109._12_4_ = 0x3f800000;
    auVar109._16_4_ = 0x3f800000;
    auVar109._20_4_ = 0x3f800000;
    auVar109._24_4_ = 0x3f800000;
    auVar109._28_4_ = 0x3f800000;
    auVar108 = vsubps_avx(auVar109,ZEXT1632(auVar9));
    fVar92 = auVar9._0_4_;
    auVar243._0_4_ = local_3a0._0_4_ * fVar92;
    fVar120 = auVar9._4_4_;
    auVar243._4_4_ = local_3a0._4_4_ * fVar120;
    fVar121 = auVar9._8_4_;
    auVar243._8_4_ = local_3a0._8_4_ * fVar121;
    fVar122 = auVar9._12_4_;
    auVar243._12_4_ = local_3a0._12_4_ * fVar122;
    auVar243._16_4_ = local_3a0._16_4_ * 0.0;
    auVar243._20_4_ = local_3a0._20_4_ * 0.0;
    auVar243._28_36_ = auVar242._28_36_;
    auVar243._24_4_ = local_3a0._24_4_ * 0.0;
    auVar51._8_8_ = uStack_1f8;
    auVar51._0_8_ = local_200;
    auVar51._16_8_ = uStack_1f0;
    auVar51._24_8_ = uStack_1e8;
    auVar241._0_4_ = (float)local_200 * fVar92;
    auVar241._4_4_ = (float)((ulong)local_200 >> 0x20) * fVar120;
    auVar241._8_4_ = (float)uStack_1f8 * fVar121;
    auVar241._12_4_ = (float)((ulong)uStack_1f8 >> 0x20) * fVar122;
    auVar241._16_4_ = (float)uStack_1f0 * 0.0;
    auVar241._20_4_ = (float)((ulong)uStack_1f0 >> 0x20) * 0.0;
    auVar241._28_36_ = auVar240._28_36_;
    auVar241._24_4_ = (float)uStack_1e8 * 0.0;
    auVar240._0_4_ = auVar249._0_4_ * fVar92;
    auVar240._4_4_ = auVar249._4_4_ * fVar120;
    auVar240._8_4_ = auVar249._8_4_ * fVar121;
    auVar240._12_4_ = auVar249._12_4_ * fVar122;
    auVar240._16_4_ = auVar249._16_4_ * 0.0;
    auVar240._20_4_ = auVar249._20_4_ * 0.0;
    auVar240._28_36_ = auVar230._28_36_;
    auVar240._24_4_ = auVar249._24_4_ * 0.0;
    auVar114._4_4_ = auVar259._4_4_ * fVar120;
    auVar114._0_4_ = auVar259._0_4_ * fVar92;
    auVar114._8_4_ = auVar259._8_4_ * fVar121;
    auVar114._12_4_ = auVar259._12_4_ * fVar122;
    auVar114._16_4_ = auVar259._16_4_ * 0.0;
    auVar114._20_4_ = auVar259._20_4_ * 0.0;
    auVar114._24_4_ = auVar259._24_4_ * 0.0;
    auVar114._28_4_ = fVar123;
    auVar9 = vfmadd231ps_fma(auVar243._0_32_,auVar108,local_380);
    auVar52._8_8_ = uStack_1d8;
    auVar52._0_8_ = local_1e0;
    auVar52._16_8_ = uStack_1d0;
    auVar52._24_8_ = uStack_1c8;
    auVar7 = vfmadd231ps_fma(auVar241._0_32_,auVar108,auVar52);
    auVar74 = vfmadd231ps_fma(auVar240._0_32_,auVar108,auVar219);
    auVar195 = vfmadd231ps_fma(auVar114,auVar108,auVar224._0_32_);
    auVar242._0_4_ = fVar92 * local_460;
    auVar242._4_4_ = fVar120 * fStack_45c;
    auVar242._8_4_ = fVar121 * fStack_458;
    auVar242._12_4_ = fVar122 * fStack_454;
    auVar242._16_4_ = fStack_450 * 0.0;
    auVar242._20_4_ = fStack_44c * 0.0;
    auVar242._28_36_ = auVar224._28_36_;
    auVar242._24_4_ = fStack_448 * 0.0;
    auVar113._4_4_ = auVar265._4_4_ * fVar120;
    auVar113._0_4_ = auVar265._0_4_ * fVar92;
    auVar113._8_4_ = auVar265._8_4_ * fVar121;
    auVar113._12_4_ = auVar265._12_4_ * fVar122;
    auVar113._16_4_ = auVar265._16_4_ * 0.0;
    auVar113._20_4_ = auVar265._20_4_ * 0.0;
    auVar113._24_4_ = auVar265._24_4_ * 0.0;
    auVar113._28_4_ = local_380._28_4_;
    fVar123 = auVar6._0_4_;
    fVar124 = auVar6._4_4_;
    auVar165._4_4_ = fVar124 * fVar120;
    auVar165._0_4_ = fVar123 * fVar92;
    auVar165._8_4_ = fVar123 * fVar121;
    auVar165._12_4_ = fVar124 * fVar122;
    auVar165._16_4_ = fVar123 * 0.0;
    auVar165._20_4_ = fVar124 * 0.0;
    auVar165._24_4_ = fVar123 * 0.0;
    auVar165._28_4_ = auVar219._28_4_;
    auVar135._4_4_ = fVar120 * fStack_43c;
    auVar135._0_4_ = fVar92 * local_440;
    auVar135._8_4_ = fVar121 * fStack_438;
    auVar135._12_4_ = fVar122 * fStack_434;
    auVar135._16_4_ = fStack_430 * 0.0;
    auVar135._20_4_ = fStack_42c * 0.0;
    uVar62 = (undefined4)((ulong)uStack_1e8 >> 0x20);
    auVar135._24_4_ = fStack_428 * 0.0;
    auVar135._28_4_ = uVar62;
    auVar78 = vfmadd231ps_fma(auVar242._0_32_,auVar108,local_3a0);
    auVar70 = vfmadd231ps_fma(auVar113,auVar108,auVar51);
    auVar69 = vfmadd231ps_fma(auVar165,auVar108,auVar249._0_32_);
    auVar129 = vfmadd231ps_fma(auVar135,auVar108,auVar259._0_32_);
    auVar184._4_4_ = fStack_3bc * fVar120;
    auVar184._0_4_ = local_3c0 * fVar92;
    auVar184._8_4_ = fStack_3b8 * fVar121;
    auVar184._12_4_ = fStack_3b4 * fVar122;
    auVar184._16_4_ = fStack_3b0 * 0.0;
    auVar184._20_4_ = fStack_3ac * 0.0;
    auVar184._24_4_ = fStack_3a8 * 0.0;
    auVar184._28_4_ = uVar62;
    auVar10._4_4_ = fVar120 * local_220._4_4_;
    auVar10._0_4_ = fVar92 * (float)local_220;
    auVar10._8_4_ = fVar121 * (float)uStack_218;
    auVar10._12_4_ = fVar122 * uStack_218._4_4_;
    auVar10._16_4_ = (float)uStack_210 * 0.0;
    auVar10._20_4_ = uStack_210._4_4_ * 0.0;
    auVar10._24_4_ = (float)uStack_208 * 0.0;
    auVar10._28_4_ = fStack_3a4;
    auVar54._28_4_ = fVar124;
    auVar54._0_28_ =
         ZEXT1628(CONCAT412(auVar78._12_4_ * fVar122,
                            CONCAT48(auVar78._8_4_ * fVar121,
                                     CONCAT44(auVar78._4_4_ * fVar120,auVar78._0_4_ * fVar92))));
    auVar9 = vfmadd231ps_fma(auVar54,auVar108,ZEXT1632(auVar9));
    auVar7 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar122 * auVar70._12_4_,
                                                CONCAT48(fVar121 * auVar70._8_4_,
                                                         CONCAT44(fVar120 * auVar70._4_4_,
                                                                  fVar92 * auVar70._0_4_)))),
                             auVar108,ZEXT1632(auVar7));
    auVar74 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar122 * auVar69._12_4_,
                                                 CONCAT48(fVar121 * auVar69._8_4_,
                                                          CONCAT44(fVar120 * auVar69._4_4_,
                                                                   fVar92 * auVar69._0_4_)))),
                              auVar108,ZEXT1632(auVar74));
    auVar195 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar122 * auVar129._12_4_,
                                                  CONCAT48(fVar121 * auVar129._8_4_,
                                                           CONCAT44(fVar120 * auVar129._4_4_,
                                                                    fVar92 * auVar129._0_4_)))),
                               auVar108,ZEXT1632(auVar195));
    auVar11._4_4_ = fVar120 * local_240._4_4_;
    auVar11._0_4_ = fVar92 * (float)local_240;
    auVar11._8_4_ = fVar121 * (float)uStack_238;
    auVar11._12_4_ = fVar122 * uStack_238._4_4_;
    auVar11._16_4_ = (float)uStack_230 * 0.0;
    auVar11._20_4_ = uStack_230._4_4_ * 0.0;
    auVar11._24_4_ = (float)uStack_228 * 0.0;
    auVar11._28_4_ = local_3a0._28_4_;
    auVar162._4_4_ = fStack_45c;
    auVar162._0_4_ = local_460;
    auVar162._8_4_ = fStack_458;
    auVar162._12_4_ = fStack_454;
    auVar162._16_4_ = fStack_450;
    auVar162._20_4_ = fStack_44c;
    auVar162._24_4_ = fStack_448;
    auVar162._28_4_ = fStack_444;
    auVar94 = vfmadd231ps_fma(auVar184,auVar108,auVar162);
    auVar78 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar94._12_4_ * fVar122,
                                                 CONCAT48(auVar94._8_4_ * fVar121,
                                                          CONCAT44(auVar94._4_4_ * fVar120,
                                                                   auVar94._0_4_ * fVar92)))),
                              auVar108,ZEXT1632(auVar78));
    auVar223._0_4_ = fVar92 * (float)local_260;
    auVar223._4_4_ = fVar120 * local_260._4_4_;
    auVar223._8_4_ = fVar121 * (float)uStack_258;
    auVar223._12_4_ = fVar122 * uStack_258._4_4_;
    auVar223._16_4_ = (float)uStack_250 * 0.0;
    auVar223._20_4_ = uStack_250._4_4_ * 0.0;
    auVar223._24_4_ = (float)uStack_248 * 0.0;
    auVar223._28_4_ = 0;
    auVar94 = vfmadd231ps_fma(auVar10,auVar108,auVar265._0_32_);
    auVar68 = vfmadd231ps_fma(auVar11,auVar108,auVar228);
    auVar179._4_4_ = fStack_43c;
    auVar179._0_4_ = local_440;
    auVar179._8_4_ = fStack_438;
    auVar179._12_4_ = fStack_434;
    auVar179._16_4_ = fStack_430;
    auVar179._20_4_ = fStack_42c;
    auVar179._24_4_ = fStack_428;
    auVar179._28_4_ = fStack_424;
    auVar95 = vfmadd231ps_fma(auVar223,auVar108,auVar179);
    auVar12._28_4_ = fVar124;
    auVar12._0_28_ =
         ZEXT1628(CONCAT412(auVar95._12_4_ * fVar122,
                            CONCAT48(auVar95._8_4_ * fVar121,
                                     CONCAT44(auVar95._4_4_ * fVar120,auVar95._0_4_ * fVar92))));
    auVar70 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar94._12_4_ * fVar122,
                                                 CONCAT48(auVar94._8_4_ * fVar121,
                                                          CONCAT44(auVar94._4_4_ * fVar120,
                                                                   auVar94._0_4_ * fVar92)))),
                              auVar108,ZEXT1632(auVar70));
    auVar69 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar122 * auVar68._12_4_,
                                                 CONCAT48(fVar121 * auVar68._8_4_,
                                                          CONCAT44(fVar120 * auVar68._4_4_,
                                                                   fVar92 * auVar68._0_4_)))),
                              auVar108,ZEXT1632(auVar69));
    auVar129 = vfmadd231ps_fma(auVar12,auVar108,ZEXT1632(auVar129));
    auVar224._28_36_ = auVar265._28_36_;
    auVar224._0_28_ =
         ZEXT1628(CONCAT412(auVar70._12_4_ * fVar122,
                            CONCAT48(auVar70._8_4_ * fVar121,
                                     CONCAT44(auVar70._4_4_ * fVar120,auVar70._0_4_ * fVar92))));
    auVar94 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar78._12_4_ * fVar122,
                                                 CONCAT48(auVar78._8_4_ * fVar121,
                                                          CONCAT44(auVar78._4_4_ * fVar120,
                                                                   auVar78._0_4_ * fVar92)))),
                              auVar108,ZEXT1632(auVar9));
    auVar68 = vfmadd231ps_fma(auVar224._0_32_,auVar108,ZEXT1632(auVar7));
    auVar95 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar122 * auVar69._12_4_,
                                                 CONCAT48(fVar121 * auVar69._8_4_,
                                                          CONCAT44(fVar120 * auVar69._4_4_,
                                                                   fVar92 * auVar69._0_4_)))),
                              auVar108,ZEXT1632(auVar74));
    auVar147 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar129._12_4_ * fVar122,
                                                  CONCAT48(auVar129._8_4_ * fVar121,
                                                           CONCAT44(auVar129._4_4_ * fVar120,
                                                                    auVar129._0_4_ * fVar92)))),
                               ZEXT1632(auVar195),auVar108);
    auVar219 = vsubps_avx(ZEXT1632(auVar78),ZEXT1632(auVar9));
    auVar108 = vsubps_avx(ZEXT1632(auVar70),ZEXT1632(auVar7));
    auVar233 = vsubps_avx(ZEXT1632(auVar69),ZEXT1632(auVar74));
    auVar114 = vsubps_avx(ZEXT1632(auVar129),ZEXT1632(auVar195));
    fVar188 = fVar125 * auVar219._0_4_ * 3.0;
    fVar202 = fVar125 * auVar219._4_4_ * 3.0;
    local_6c0._4_4_ = fVar202;
    local_6c0._0_4_ = fVar188;
    fVar203 = fVar125 * auVar219._8_4_ * 3.0;
    local_6c0._8_4_ = fVar203;
    fVar204 = fVar125 * auVar219._12_4_ * 3.0;
    local_6c0._12_4_ = fVar204;
    fVar205 = fVar125 * auVar219._16_4_ * 3.0;
    local_6c0._16_4_ = fVar205;
    fVar206 = fVar125 * auVar219._20_4_ * 3.0;
    local_6c0._20_4_ = fVar206;
    fVar207 = fVar125 * auVar219._24_4_ * 3.0;
    local_6c0._24_4_ = fVar207;
    local_6c0._28_4_ = 0x40400000;
    local_980._0_4_ = fVar125 * auVar108._0_4_ * 3.0;
    local_980._4_4_ = fVar125 * auVar108._4_4_ * 3.0;
    local_980._8_4_ = fVar125 * auVar108._8_4_ * 3.0;
    local_980._12_4_ = fVar125 * auVar108._12_4_ * 3.0;
    local_980._16_4_ = fVar125 * auVar108._16_4_ * 3.0;
    local_980._20_4_ = fVar125 * auVar108._20_4_ * 3.0;
    local_980._24_4_ = fVar125 * auVar108._24_4_ * 3.0;
    local_980._28_4_ = 0;
    local_a40._0_4_ = fVar125 * auVar233._0_4_ * 3.0;
    local_a40._4_4_ = fVar125 * auVar233._4_4_ * 3.0;
    local_a40._8_4_ = fVar125 * auVar233._8_4_ * 3.0;
    local_a40._12_4_ = fVar125 * auVar233._12_4_ * 3.0;
    local_a40._16_4_ = fVar125 * auVar233._16_4_ * 3.0;
    local_a40._20_4_ = fVar125 * auVar233._20_4_ * 3.0;
    local_a40._24_4_ = fVar125 * auVar233._24_4_ * 3.0;
    local_a40._28_4_ = 0;
    fVar92 = fVar125 * auVar114._0_4_ * 3.0;
    fVar120 = fVar125 * auVar114._4_4_ * 3.0;
    auVar220._4_4_ = fVar120;
    auVar220._0_4_ = fVar92;
    fVar121 = fVar125 * auVar114._8_4_ * 3.0;
    auVar220._8_4_ = fVar121;
    fVar122 = fVar125 * auVar114._12_4_ * 3.0;
    auVar220._12_4_ = fVar122;
    fVar123 = fVar125 * auVar114._16_4_ * 3.0;
    auVar220._16_4_ = fVar123;
    fVar124 = fVar125 * auVar114._20_4_ * 3.0;
    auVar220._20_4_ = fVar124;
    fVar125 = fVar125 * auVar114._24_4_ * 3.0;
    auVar220._24_4_ = fVar125;
    auVar220._28_4_ = auVar219._28_4_;
    auVar179 = ZEXT1632(auVar94);
    auVar11 = vpermps_avx2(_DAT_01fb7720,auVar179);
    _local_7e0 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar68));
    local_960 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar95));
    local_2a0 = vsubps_avx(auVar11,ZEXT1632(auVar94));
    auVar113 = vsubps_avx(local_960,ZEXT1632(auVar95));
    auVar162 = ZEXT1632(auVar95);
    fVar126 = auVar113._0_4_;
    fVar127 = auVar113._4_4_;
    auVar234._4_4_ = fVar127 * fVar202;
    auVar234._0_4_ = fVar126 * fVar188;
    fVar188 = auVar113._8_4_;
    auVar234._8_4_ = fVar188 * fVar203;
    fVar202 = auVar113._12_4_;
    auVar234._12_4_ = fVar202 * fVar204;
    fVar203 = auVar113._16_4_;
    auVar234._16_4_ = fVar203 * fVar205;
    fVar204 = auVar113._20_4_;
    auVar234._20_4_ = fVar204 * fVar206;
    fVar205 = auVar113._24_4_;
    auVar234._24_4_ = fVar205 * fVar207;
    auVar234._28_4_ = local_960._28_4_;
    auVar9 = vfmsub231ps_fma(auVar234,local_a40,local_2a0);
    local_2c0 = vsubps_avx(_local_7e0,ZEXT1632(auVar68));
    fVar247 = local_2a0._0_4_;
    fVar250 = local_2a0._4_4_;
    auVar258._4_4_ = fVar250 * local_980._4_4_;
    auVar258._0_4_ = fVar247 * (float)local_980._0_4_;
    fVar251 = local_2a0._8_4_;
    auVar258._8_4_ = fVar251 * local_980._8_4_;
    fVar252 = local_2a0._12_4_;
    auVar258._12_4_ = fVar252 * local_980._12_4_;
    fVar253 = local_2a0._16_4_;
    auVar258._16_4_ = fVar253 * local_980._16_4_;
    fVar254 = local_2a0._20_4_;
    auVar258._20_4_ = fVar254 * local_980._20_4_;
    fVar255 = local_2a0._24_4_;
    auVar258._24_4_ = fVar255 * local_980._24_4_;
    auVar258._28_4_ = auVar11._28_4_;
    auVar7 = vfmsub231ps_fma(auVar258,local_6c0,local_2c0);
    auVar9 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar7._12_4_ * auVar7._12_4_,
                                                CONCAT48(auVar7._8_4_ * auVar7._8_4_,
                                                         CONCAT44(auVar7._4_4_ * auVar7._4_4_,
                                                                  auVar7._0_4_ * auVar7._0_4_)))),
                             ZEXT1632(auVar9),ZEXT1632(auVar9));
    auVar133._0_4_ = fVar126 * fVar126;
    auVar133._4_4_ = fVar127 * fVar127;
    auVar133._8_4_ = fVar188 * fVar188;
    auVar133._12_4_ = fVar202 * fVar202;
    auVar133._16_4_ = fVar203 * fVar203;
    auVar133._20_4_ = fVar204 * fVar204;
    auVar133._24_4_ = fVar205 * fVar205;
    auVar133._28_4_ = 0;
    auVar7 = vfmadd231ps_fma(auVar133,local_2c0,local_2c0);
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),local_2a0,local_2a0);
    fVar206 = local_2c0._0_4_;
    auVar163._0_4_ = fVar206 * (float)local_a40._0_4_;
    fVar207 = local_2c0._4_4_;
    auVar163._4_4_ = fVar207 * local_a40._4_4_;
    fVar143 = local_2c0._8_4_;
    auVar163._8_4_ = fVar143 * local_a40._8_4_;
    fVar144 = local_2c0._12_4_;
    auVar163._12_4_ = fVar144 * local_a40._12_4_;
    fVar145 = local_2c0._16_4_;
    auVar163._16_4_ = fVar145 * local_a40._16_4_;
    fVar146 = local_2c0._20_4_;
    auVar163._20_4_ = fVar146 * local_a40._20_4_;
    fVar168 = local_2c0._24_4_;
    auVar163._24_4_ = fVar168 * local_a40._24_4_;
    auVar163._28_4_ = 0;
    auVar108 = vrcpps_avx(ZEXT1632(auVar7));
    auVar74 = vfmsub231ps_fma(auVar163,local_980,auVar113);
    auVar74 = vfmadd231ps_fma(ZEXT1632(auVar9),ZEXT1632(auVar74),ZEXT1632(auVar74));
    auVar244._8_4_ = 0x3f800000;
    auVar244._0_8_ = 0x3f8000003f800000;
    auVar244._12_4_ = 0x3f800000;
    auVar244._16_4_ = 0x3f800000;
    auVar244._20_4_ = 0x3f800000;
    auVar244._24_4_ = 0x3f800000;
    auVar244._28_4_ = 0x3f800000;
    auVar9 = vfnmadd213ps_fma(auVar108,ZEXT1632(auVar7),auVar244);
    auVar9 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar108,auVar108);
    local_a60 = vpermps_avx2(_DAT_01fb7720,local_6c0);
    local_800 = vpermps_avx2(_DAT_01fb7720,local_a40);
    auVar260._4_4_ = local_a60._4_4_ * fVar127;
    auVar260._0_4_ = local_a60._0_4_ * fVar126;
    auVar260._8_4_ = local_a60._8_4_ * fVar188;
    auVar260._12_4_ = local_a60._12_4_ * fVar202;
    auVar260._16_4_ = local_a60._16_4_ * fVar203;
    auVar260._20_4_ = local_a60._20_4_ * fVar204;
    auVar260._24_4_ = local_a60._24_4_ * fVar205;
    auVar260._28_4_ = auVar108._28_4_;
    auVar195 = vfmsub231ps_fma(auVar260,local_800,local_2a0);
    local_820 = vpermps_avx2(_DAT_01fb7720,local_980);
    auVar8._4_4_ = fVar250 * local_820._4_4_;
    auVar8._0_4_ = fVar247 * local_820._0_4_;
    auVar8._8_4_ = fVar251 * local_820._8_4_;
    auVar8._12_4_ = fVar252 * local_820._12_4_;
    auVar8._16_4_ = fVar253 * local_820._16_4_;
    auVar8._20_4_ = fVar254 * local_820._20_4_;
    auVar8._24_4_ = fVar255 * local_820._24_4_;
    auVar8._28_4_ = 0x40400000;
    auVar78 = vfmsub231ps_fma(auVar8,local_a60,local_2c0);
    auVar195 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar78._12_4_ * auVar78._12_4_,
                                                  CONCAT48(auVar78._8_4_ * auVar78._8_4_,
                                                           CONCAT44(auVar78._4_4_ * auVar78._4_4_,
                                                                    auVar78._0_4_ * auVar78._0_4_)))
                                       ),ZEXT1632(auVar195),ZEXT1632(auVar195));
    auVar180._0_4_ = fVar206 * local_800._0_4_;
    auVar180._4_4_ = fVar207 * local_800._4_4_;
    auVar180._8_4_ = fVar143 * local_800._8_4_;
    auVar180._12_4_ = fVar144 * local_800._12_4_;
    auVar180._16_4_ = fVar145 * local_800._16_4_;
    auVar180._20_4_ = fVar146 * local_800._20_4_;
    auVar180._24_4_ = fVar168 * local_800._24_4_;
    auVar180._28_4_ = 0;
    auVar78 = vfmsub231ps_fma(auVar180,local_820,auVar113);
    auVar195 = vfmadd231ps_fma(ZEXT1632(auVar195),ZEXT1632(auVar78),ZEXT1632(auVar78));
    auVar108 = vmaxps_avx(ZEXT1632(CONCAT412(auVar74._12_4_ * auVar9._12_4_,
                                             CONCAT48(auVar74._8_4_ * auVar9._8_4_,
                                                      CONCAT44(auVar74._4_4_ * auVar9._4_4_,
                                                               auVar74._0_4_ * auVar9._0_4_)))),
                          ZEXT1632(CONCAT412(auVar195._12_4_ * auVar9._12_4_,
                                             CONCAT48(auVar195._8_4_ * auVar9._8_4_,
                                                      CONCAT44(auVar195._4_4_ * auVar9._4_4_,
                                                               auVar195._0_4_ * auVar9._0_4_)))));
    local_720._0_4_ = auVar147._0_4_ + fVar92;
    local_720._4_4_ = auVar147._4_4_ + fVar120;
    local_720._8_4_ = auVar147._8_4_ + fVar121;
    local_720._12_4_ = auVar147._12_4_ + fVar122;
    local_720._16_4_ = fVar123 + 0.0;
    local_720._20_4_ = fVar124 + 0.0;
    local_720._24_4_ = fVar125 + 0.0;
    local_720._28_4_ = auVar219._28_4_ + 0.0;
    local_700 = ZEXT1632(auVar147);
    auVar219 = vsubps_avx(local_700,auVar220);
    local_740 = vpermps_avx2(_DAT_01fb7720,auVar219);
    auVar12 = vpermps_avx2(_DAT_01fb7720,local_700);
    auVar219 = vmaxps_avx(local_700,local_720);
    auVar114 = vrsqrtps_avx(ZEXT1632(auVar7));
    auVar233 = vmaxps_avx(local_740,auVar12);
    auVar219 = vmaxps_avx(auVar219,auVar233);
    fVar92 = auVar114._0_4_;
    fVar120 = auVar114._4_4_;
    fVar121 = auVar114._8_4_;
    fVar122 = auVar114._12_4_;
    fVar125 = auVar114._16_4_;
    fVar123 = auVar114._20_4_;
    fVar124 = auVar114._24_4_;
    auVar53._4_4_ = fVar120 * fVar120 * fVar120 * auVar7._4_4_ * -0.5;
    auVar53._0_4_ = fVar92 * fVar92 * fVar92 * auVar7._0_4_ * -0.5;
    auVar53._8_4_ = fVar121 * fVar121 * fVar121 * auVar7._8_4_ * -0.5;
    auVar53._12_4_ = fVar122 * fVar122 * fVar122 * auVar7._12_4_ * -0.5;
    auVar53._16_4_ = fVar125 * fVar125 * fVar125 * -0.0;
    auVar53._20_4_ = fVar123 * fVar123 * fVar123 * -0.0;
    auVar53._24_4_ = fVar124 * fVar124 * fVar124 * -0.0;
    auVar53._28_4_ = DAT_01fb7720._28_4_;
    auVar82._8_4_ = 0x3fc00000;
    auVar82._0_8_ = 0x3fc000003fc00000;
    auVar82._12_4_ = 0x3fc00000;
    auVar82._16_4_ = 0x3fc00000;
    auVar82._20_4_ = 0x3fc00000;
    auVar82._24_4_ = 0x3fc00000;
    auVar82._28_4_ = 0x3fc00000;
    auVar9 = vfmadd231ps_fma(auVar53,auVar82,auVar114);
    fVar120 = auVar9._0_4_;
    fVar121 = auVar9._4_4_;
    auVar14._4_4_ = fVar207 * fVar121;
    auVar14._0_4_ = fVar206 * fVar120;
    fVar125 = auVar9._8_4_;
    auVar14._8_4_ = fVar143 * fVar125;
    fVar124 = auVar9._12_4_;
    auVar14._12_4_ = fVar144 * fVar124;
    auVar14._16_4_ = fVar145 * 0.0;
    auVar14._20_4_ = fVar146 * 0.0;
    auVar14._24_4_ = fVar168 * 0.0;
    auVar14._28_4_ = 0x3fc00000;
    auVar15._4_4_ = fStack_67c * fVar127 * fVar121;
    auVar15._0_4_ = local_680 * fVar126 * fVar120;
    auVar15._8_4_ = fStack_678 * fVar188 * fVar125;
    auVar15._12_4_ = fStack_674 * fVar202 * fVar124;
    auVar15._16_4_ = fStack_670 * fVar203 * 0.0;
    auVar15._20_4_ = fStack_66c * fVar204 * 0.0;
    auVar15._24_4_ = fStack_668 * fVar205 * 0.0;
    auVar15._28_4_ = auVar113._28_4_;
    auVar7 = vfmadd231ps_fma(auVar15,auVar14,local_540);
    auVar114 = vsubps_avx(ZEXT832(0) << 0x20,auVar162);
    fVar143 = auVar114._0_4_;
    fVar144 = auVar114._4_4_;
    auVar16._4_4_ = fVar144 * fVar127 * fVar121;
    auVar16._0_4_ = fVar143 * fVar126 * fVar120;
    fVar145 = auVar114._8_4_;
    auVar16._8_4_ = fVar145 * fVar188 * fVar125;
    fVar146 = auVar114._12_4_;
    auVar16._12_4_ = fVar146 * fVar202 * fVar124;
    fVar168 = auVar114._16_4_;
    auVar16._16_4_ = fVar168 * fVar203 * 0.0;
    fVar169 = auVar114._20_4_;
    auVar16._20_4_ = fVar169 * fVar204 * 0.0;
    fVar170 = auVar114._24_4_;
    auVar16._24_4_ = fVar170 * fVar205 * 0.0;
    auVar16._28_4_ = 0;
    auVar260 = ZEXT1632(auVar68);
    auVar165 = vsubps_avx(ZEXT832(0) << 0x20,auVar260);
    auVar74 = vfmadd231ps_fma(auVar16,auVar165,auVar14);
    local_860 = ZEXT1632(auVar9);
    auVar17._4_4_ = fVar250 * fVar121;
    auVar17._0_4_ = fVar247 * fVar120;
    auVar17._8_4_ = fVar251 * fVar125;
    auVar17._12_4_ = fVar252 * fVar124;
    auVar17._16_4_ = fVar253 * 0.0;
    auVar17._20_4_ = fVar254 * 0.0;
    auVar17._24_4_ = fVar255 * 0.0;
    auVar17._28_4_ = 0x3fc00000;
    auVar9 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar17,_local_560);
    auVar234 = ZEXT832(0) << 0x20;
    auVar135 = vsubps_avx(auVar234,auVar179);
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar135,auVar17);
    auVar18._4_4_ = fStack_67c * fVar144;
    auVar18._0_4_ = local_680 * fVar143;
    auVar18._8_4_ = fStack_678 * fVar145;
    auVar18._12_4_ = fStack_674 * fVar146;
    auVar18._16_4_ = fStack_670 * fVar168;
    auVar18._20_4_ = fStack_66c * fVar169;
    auVar18._24_4_ = fStack_668 * fVar170;
    auVar18._28_4_ = 0x3fc00000;
    auVar74 = vfmadd231ps_fma(auVar18,local_540,auVar165);
    auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),_local_560,auVar135);
    fVar92 = auVar9._0_4_;
    fVar202 = auVar7._0_4_;
    fVar122 = auVar9._4_4_;
    fVar203 = auVar7._4_4_;
    fVar123 = auVar9._8_4_;
    fVar204 = auVar7._8_4_;
    fVar188 = auVar9._12_4_;
    fVar205 = auVar7._12_4_;
    auVar19._28_4_ = local_540._28_4_;
    auVar19._0_28_ =
         ZEXT1628(CONCAT412(fVar205 * fVar188,
                            CONCAT48(fVar204 * fVar123,CONCAT44(fVar203 * fVar122,fVar202 * fVar92))
                           ));
    auVar184 = vsubps_avx(ZEXT1632(auVar74),auVar19);
    auVar20._4_4_ = fVar144 * fVar144;
    auVar20._0_4_ = fVar143 * fVar143;
    auVar20._8_4_ = fVar145 * fVar145;
    auVar20._12_4_ = fVar146 * fVar146;
    auVar20._16_4_ = fVar168 * fVar168;
    auVar20._20_4_ = fVar169 * fVar169;
    auVar20._24_4_ = fVar170 * fVar170;
    auVar20._28_4_ = local_540._28_4_;
    auVar74 = vfmadd231ps_fma(auVar20,auVar165,auVar165);
    auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar135,auVar135);
    auVar258 = ZEXT1632(auVar7);
    auVar21._28_4_ = local_560._28_4_;
    auVar21._0_28_ =
         ZEXT1628(CONCAT412(fVar205 * fVar205,
                            CONCAT48(fVar204 * fVar204,CONCAT44(fVar203 * fVar203,fVar202 * fVar202)
                                    )));
    auVar10 = vsubps_avx(ZEXT1632(auVar74),auVar21);
    auVar233 = vsqrtps_avx(auVar108);
    fVar127 = auVar233._28_4_ + auVar219._28_4_;
    fVar202 = (auVar233._0_4_ + auVar219._0_4_) * 1.0000002;
    fVar203 = (auVar233._4_4_ + auVar219._4_4_) * 1.0000002;
    fVar204 = (auVar233._8_4_ + auVar219._8_4_) * 1.0000002;
    fVar205 = (auVar233._12_4_ + auVar219._12_4_) * 1.0000002;
    fVar206 = (auVar233._16_4_ + auVar219._16_4_) * 1.0000002;
    fVar207 = (auVar233._20_4_ + auVar219._20_4_) * 1.0000002;
    fVar126 = (auVar233._24_4_ + auVar219._24_4_) * 1.0000002;
    auVar22._4_4_ = fVar203 * fVar203;
    auVar22._0_4_ = fVar202 * fVar202;
    auVar22._8_4_ = fVar204 * fVar204;
    auVar22._12_4_ = fVar205 * fVar205;
    auVar22._16_4_ = fVar206 * fVar206;
    auVar22._20_4_ = fVar207 * fVar207;
    auVar22._24_4_ = fVar126 * fVar126;
    auVar22._28_4_ = fVar127;
    fVar206 = auVar184._0_4_ + auVar184._0_4_;
    fVar207 = auVar184._4_4_ + auVar184._4_4_;
    local_300._0_8_ = CONCAT44(fVar207,fVar206);
    local_300._8_4_ = auVar184._8_4_ + auVar184._8_4_;
    local_300._12_4_ = auVar184._12_4_ + auVar184._12_4_;
    local_300._16_4_ = auVar184._16_4_ + auVar184._16_4_;
    local_300._20_4_ = auVar184._20_4_ + auVar184._20_4_;
    local_300._24_4_ = auVar184._24_4_ + auVar184._24_4_;
    local_300._28_4_ = auVar184._28_4_ + auVar184._28_4_;
    auVar219 = vsubps_avx(auVar10,auVar22);
    local_2e0._28_4_ = local_a60._28_4_;
    local_2e0._0_28_ =
         ZEXT1628(CONCAT412(fVar188 * fVar188,
                            CONCAT48(fVar123 * fVar123,CONCAT44(fVar122 * fVar122,fVar92 * fVar92)))
                 );
    local_620 = vsubps_avx(local_280,local_2e0);
    auVar23._4_4_ = fVar207 * fVar207;
    auVar23._0_4_ = fVar206 * fVar206;
    auVar23._8_4_ = local_300._8_4_ * local_300._8_4_;
    auVar23._12_4_ = local_300._12_4_ * local_300._12_4_;
    auVar23._16_4_ = local_300._16_4_ * local_300._16_4_;
    auVar23._20_4_ = local_300._20_4_ * local_300._20_4_;
    auVar23._24_4_ = local_300._24_4_ * local_300._24_4_;
    auVar23._28_4_ = fVar127;
    fVar122 = local_620._0_4_;
    fVar123 = local_620._4_4_;
    fVar188 = local_620._8_4_;
    fVar202 = local_620._12_4_;
    fVar203 = local_620._16_4_;
    fVar204 = local_620._20_4_;
    fVar205 = local_620._24_4_;
    auVar24._4_4_ = fVar123 * 4.0 * auVar219._4_4_;
    auVar24._0_4_ = fVar122 * 4.0 * auVar219._0_4_;
    auVar24._8_4_ = fVar188 * 4.0 * auVar219._8_4_;
    auVar24._12_4_ = fVar202 * 4.0 * auVar219._12_4_;
    auVar24._16_4_ = fVar203 * 4.0 * auVar219._16_4_;
    auVar24._20_4_ = fVar204 * 4.0 * auVar219._20_4_;
    auVar24._24_4_ = fVar205 * 4.0 * auVar219._24_4_;
    auVar24._28_4_ = 0x40800000;
    auVar184 = vsubps_avx(auVar23,auVar24);
    auVar108 = vcmpps_avx(auVar184,auVar234,5);
    auVar230 = ZEXT3264(auVar108);
    auVar242 = ZEXT3264(CONCAT428(0x80000000,
                                  CONCAT424(0x80000000,
                                            CONCAT420(0x80000000,
                                                      CONCAT416(0x80000000,
                                                                CONCAT412(0x80000000,
                                                                          CONCAT48(0x80000000,
                                                                                                                                                                      
                                                  0x8000000080000000)))))));
    local_320._0_4_ = fVar122 + fVar122;
    local_320._4_4_ = fVar123 + fVar123;
    local_320._8_4_ = fVar188 + fVar188;
    local_320._12_4_ = fVar202 + fVar202;
    local_320._16_4_ = fVar203 + fVar203;
    local_320._20_4_ = fVar204 + fVar204;
    local_320._24_4_ = fVar205 + fVar205;
    fVar92 = local_620._28_4_;
    local_320._28_4_ = fVar92 + fVar92;
    auVar220 = ZEXT1632(auVar9);
    if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar108 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar108 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar108 >> 0x7f,0) == '\0') &&
          (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar108 >> 0xbf,0) == '\0') &&
        (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar108[0x1f])
    {
      auVar110._8_4_ = 0x7f800000;
      auVar110._0_8_ = 0x7f8000007f800000;
      auVar110._12_4_ = 0x7f800000;
      auVar110._16_4_ = 0x7f800000;
      auVar110._20_4_ = 0x7f800000;
      auVar110._24_4_ = 0x7f800000;
      auVar110._28_4_ = 0x7f800000;
      auVar261._8_4_ = 0xff800000;
      auVar261._0_8_ = 0xff800000ff800000;
      auVar261._12_4_ = 0xff800000;
      auVar261._16_4_ = 0xff800000;
      auVar261._20_4_ = 0xff800000;
      auVar261._24_4_ = 0xff800000;
      auVar261._28_4_ = 0xff800000;
    }
    else {
      auVar8 = vsqrtps_avx(auVar184);
      auVar184 = vcmpps_avx(auVar184,auVar234,5);
      auVar108 = vrcpps_avx(local_320);
      auVar235._8_4_ = 0x3f800000;
      auVar235._0_8_ = 0x3f8000003f800000;
      auVar235._12_4_ = 0x3f800000;
      auVar235._16_4_ = 0x3f800000;
      auVar235._20_4_ = 0x3f800000;
      auVar235._24_4_ = 0x3f800000;
      auVar235._28_4_ = 0x3f800000;
      auVar9 = vfnmadd213ps_fma(auVar108,local_320,auVar235);
      auVar9 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar108,auVar108);
      auVar211._0_8_ = local_300._0_8_ ^ 0x8000000080000000;
      auVar211._8_4_ = -local_300._8_4_;
      auVar211._12_4_ = -local_300._12_4_;
      auVar211._16_4_ = -local_300._16_4_;
      auVar211._20_4_ = -local_300._20_4_;
      auVar211._24_4_ = -local_300._24_4_;
      auVar211._28_4_ = -local_300._28_4_;
      auVar108 = vsubps_avx(auVar211,auVar8);
      auVar25._4_4_ = auVar9._4_4_ * auVar108._4_4_;
      auVar25._0_4_ = auVar9._0_4_ * auVar108._0_4_;
      auVar25._8_4_ = auVar9._8_4_ * auVar108._8_4_;
      auVar25._12_4_ = auVar9._12_4_ * auVar108._12_4_;
      auVar25._16_4_ = auVar108._16_4_ * 0.0;
      auVar25._20_4_ = auVar108._20_4_ * 0.0;
      auVar25._24_4_ = auVar108._24_4_ * 0.0;
      auVar25._28_4_ = local_300._28_4_;
      auVar108 = vsubps_avx(auVar8,local_300);
      auVar262._0_4_ = auVar9._0_4_ * auVar108._0_4_;
      auVar262._4_4_ = auVar9._4_4_ * auVar108._4_4_;
      auVar262._8_4_ = auVar9._8_4_ * auVar108._8_4_;
      auVar262._12_4_ = auVar9._12_4_ * auVar108._12_4_;
      auVar262._16_4_ = auVar108._16_4_ * 0.0;
      auVar262._20_4_ = auVar108._20_4_ * 0.0;
      auVar262._24_4_ = auVar108._24_4_ * 0.0;
      auVar262._28_4_ = 0;
      auVar9 = vfmadd213ps_fma(auVar220,auVar25,auVar258);
      local_3e0 = fVar120 * auVar9._0_4_;
      fStack_3dc = fVar121 * auVar9._4_4_;
      fStack_3d8 = fVar125 * auVar9._8_4_;
      fStack_3d4 = fVar124 * auVar9._12_4_;
      uStack_3d0 = 0;
      uStack_3cc = 0;
      uStack_3c8 = 0;
      fStack_3c4 = fVar92;
      auVar108 = vandps_avx(local_2e0,local_6a0);
      auVar108 = vmaxps_avx(local_480,auVar108);
      auVar26._4_4_ = auVar108._4_4_ * 1.9073486e-06;
      auVar26._0_4_ = auVar108._0_4_ * 1.9073486e-06;
      auVar26._8_4_ = auVar108._8_4_ * 1.9073486e-06;
      auVar26._12_4_ = auVar108._12_4_ * 1.9073486e-06;
      auVar26._16_4_ = auVar108._16_4_ * 1.9073486e-06;
      auVar26._20_4_ = auVar108._20_4_ * 1.9073486e-06;
      auVar26._24_4_ = auVar108._24_4_ * 1.9073486e-06;
      auVar26._28_4_ = auVar108._28_4_;
      auVar108 = vandps_avx(local_620,local_6a0);
      auVar108 = vcmpps_avx(auVar108,auVar26,1);
      auVar9 = vfmadd213ps_fma(auVar220,auVar262,auVar258);
      auVar111._8_4_ = 0x7f800000;
      auVar111._0_8_ = 0x7f8000007f800000;
      auVar111._12_4_ = 0x7f800000;
      auVar111._16_4_ = 0x7f800000;
      auVar111._20_4_ = 0x7f800000;
      auVar111._24_4_ = 0x7f800000;
      auVar111._28_4_ = 0x7f800000;
      auVar110 = vblendvps_avx(auVar111,auVar25,auVar184);
      local_400 = auVar9._0_4_ * fVar120;
      fStack_3fc = auVar9._4_4_ * fVar121;
      fStack_3f8 = auVar9._8_4_ * fVar125;
      fStack_3f4 = auVar9._12_4_ * fVar124;
      uStack_3f0 = 0;
      uStack_3ec = 0;
      uStack_3e8 = 0;
      fStack_3e4 = fVar92;
      auVar236._8_4_ = 0xff800000;
      auVar236._0_8_ = 0xff800000ff800000;
      auVar236._12_4_ = 0xff800000;
      auVar236._16_4_ = 0xff800000;
      auVar236._20_4_ = 0xff800000;
      auVar236._24_4_ = 0xff800000;
      auVar236._28_4_ = 0xff800000;
      auVar261 = vblendvps_avx(auVar236,auVar262,auVar184);
      auVar234 = auVar184 & auVar108;
      if ((((((((auVar234 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar234 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar234 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar234 >> 0x7f,0) != '\0') ||
            (auVar234 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar234 >> 0xbf,0) != '\0') ||
          (auVar234 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar234[0x1f] < '\0') {
        auVar108 = vandps_avx(auVar184,auVar108);
        auVar234 = vcmpps_avx(auVar219,_DAT_01f7b000,2);
        auVar91._8_4_ = 0xff800000;
        auVar91._0_8_ = 0xff800000ff800000;
        auVar91._12_4_ = 0xff800000;
        auVar91._16_4_ = 0xff800000;
        auVar91._20_4_ = 0xff800000;
        auVar91._24_4_ = 0xff800000;
        auVar91._28_4_ = 0xff800000;
        auVar248._8_4_ = 0x7f800000;
        auVar248._0_8_ = 0x7f8000007f800000;
        auVar248._12_4_ = 0x7f800000;
        auVar248._16_4_ = 0x7f800000;
        auVar248._20_4_ = 0x7f800000;
        auVar248._24_4_ = 0x7f800000;
        auVar248._28_4_ = 0x7f800000;
        auVar219 = vblendvps_avx(auVar248,auVar91,auVar234);
        auVar9 = vpackssdw_avx(auVar108._0_16_,auVar108._16_16_);
        auVar8 = vpmovsxwd_avx2(auVar9);
        auVar110 = vblendvps_avx(auVar110,auVar219,auVar8);
        auVar219 = vblendvps_avx(auVar91,auVar248,auVar234);
        auVar242 = ZEXT3264(auVar219);
        auVar261 = vblendvps_avx(auVar261,auVar219,auVar8);
        auVar216._0_8_ = auVar108._0_8_ ^ 0xffffffffffffffff;
        auVar216._8_4_ = auVar108._8_4_ ^ 0xffffffff;
        auVar216._12_4_ = auVar108._12_4_ ^ 0xffffffff;
        auVar216._16_4_ = auVar108._16_4_ ^ 0xffffffff;
        auVar216._20_4_ = auVar108._20_4_ ^ 0xffffffff;
        auVar216._24_4_ = auVar108._24_4_ ^ 0xffffffff;
        auVar216._28_4_ = auVar108._28_4_ ^ 0xffffffff;
        auVar108 = vorps_avx(auVar234,auVar216);
        auVar108 = vandps_avx(auVar184,auVar108);
        auVar230 = ZEXT3264(auVar108);
      }
    }
    local_600 = auVar230._0_32_;
    auVar108 = local_340 & local_600;
    auVar240 = ZEXT3264(local_540);
    if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar108 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar108 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar108 >> 0x7f,0) == '\0') &&
          (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar108 >> 0xbf,0) == '\0') &&
        (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar108[0x1f])
    {
      auVar224 = ZEXT3264(local_8c0);
      auVar249 = ZEXT3264(local_8e0);
      auVar259 = ZEXT3264(local_840);
      auVar265 = ZEXT3264(local_a20);
    }
    else {
      fVar92 = (ray->org).field_0.m128[3] - (float)local_7c0._0_4_;
      auVar83._4_4_ = fVar92;
      auVar83._0_4_ = fVar92;
      auVar83._8_4_ = fVar92;
      auVar83._12_4_ = fVar92;
      auVar83._16_4_ = fVar92;
      auVar83._20_4_ = fVar92;
      auVar83._24_4_ = fVar92;
      auVar83._28_4_ = fVar92;
      auVar184 = vmaxps_avx(auVar83,auVar110);
      fVar92 = ray->tfar - (float)local_7c0._0_4_;
      auVar112._4_4_ = fVar92;
      auVar112._0_4_ = fVar92;
      auVar112._8_4_ = fVar92;
      auVar112._12_4_ = fVar92;
      auVar112._16_4_ = fVar92;
      auVar112._20_4_ = fVar92;
      auVar112._24_4_ = fVar92;
      auVar112._28_4_ = fVar92;
      auVar234 = vminps_avx(auVar112,auVar261);
      auVar27._4_4_ = local_a40._4_4_ * fVar144;
      auVar27._0_4_ = (float)local_a40._0_4_ * fVar143;
      auVar27._8_4_ = local_a40._8_4_ * fVar145;
      auVar27._12_4_ = local_a40._12_4_ * fVar146;
      auVar27._16_4_ = local_a40._16_4_ * fVar168;
      auVar27._20_4_ = local_a40._20_4_ * fVar169;
      auVar27._24_4_ = local_a40._24_4_ * fVar170;
      auVar27._28_4_ = fVar92;
      auVar9 = vfmadd213ps_fma(auVar165,local_980,auVar27);
      auVar7 = vfmadd213ps_fma(auVar135,local_6c0,ZEXT1632(auVar9));
      auVar28._4_4_ = local_a40._4_4_ * fStack_67c;
      auVar28._0_4_ = (float)local_a40._0_4_ * local_680;
      auVar28._8_4_ = local_a40._8_4_ * fStack_678;
      auVar28._12_4_ = local_a40._12_4_ * fStack_674;
      auVar28._16_4_ = local_a40._16_4_ * fStack_670;
      auVar28._20_4_ = local_a40._20_4_ * fStack_66c;
      auVar28._24_4_ = local_a40._24_4_ * fStack_668;
      auVar28._28_4_ = auVar114._28_4_;
      auVar9 = vfmadd231ps_fma(auVar28,local_540,local_980);
      auVar74 = vfmadd231ps_fma(ZEXT1632(auVar9),_local_560,local_6c0);
      auVar242 = ZEXT3264(local_6a0);
      auVar108 = vandps_avx(local_6a0,ZEXT1632(auVar74));
      auVar181._8_4_ = 0x219392ef;
      auVar181._0_8_ = 0x219392ef219392ef;
      auVar181._12_4_ = 0x219392ef;
      auVar181._16_4_ = 0x219392ef;
      auVar181._20_4_ = 0x219392ef;
      auVar181._24_4_ = 0x219392ef;
      auVar181._28_4_ = 0x219392ef;
      auVar219 = vcmpps_avx(auVar108,auVar181,1);
      auVar108 = vrcpps_avx(ZEXT1632(auVar74));
      auVar263._8_4_ = 0x3f800000;
      auVar263._0_8_ = 0x3f8000003f800000;
      auVar263._12_4_ = 0x3f800000;
      auVar263._16_4_ = 0x3f800000;
      auVar263._20_4_ = 0x3f800000;
      auVar263._24_4_ = 0x3f800000;
      auVar263._28_4_ = 0x3f800000;
      auVar165 = ZEXT1632(auVar74);
      auVar9 = vfnmadd213ps_fma(auVar108,auVar165,auVar263);
      auVar9 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar108,auVar108);
      auVar237._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
      auVar237._8_4_ = auVar74._8_4_ ^ 0x80000000;
      auVar237._12_4_ = auVar74._12_4_ ^ 0x80000000;
      auVar237._16_4_ = 0x80000000;
      auVar237._20_4_ = 0x80000000;
      auVar237._24_4_ = 0x80000000;
      auVar237._28_4_ = 0x80000000;
      auVar29._4_4_ = auVar9._4_4_ * -auVar7._4_4_;
      auVar29._0_4_ = auVar9._0_4_ * -auVar7._0_4_;
      auVar29._8_4_ = auVar9._8_4_ * -auVar7._8_4_;
      auVar29._12_4_ = auVar9._12_4_ * -auVar7._12_4_;
      auVar29._16_4_ = 0x80000000;
      auVar29._20_4_ = 0x80000000;
      auVar29._24_4_ = 0x80000000;
      auVar29._28_4_ = 0x80000000;
      auVar108 = vcmpps_avx(auVar165,auVar237,1);
      auVar108 = vorps_avx(auVar219,auVar108);
      auVar245._8_4_ = 0xff800000;
      auVar245._0_8_ = 0xff800000ff800000;
      auVar245._12_4_ = 0xff800000;
      auVar245._16_4_ = 0xff800000;
      auVar245._20_4_ = 0xff800000;
      auVar245._24_4_ = 0xff800000;
      auVar245._28_4_ = 0xff800000;
      auVar108 = vblendvps_avx(auVar29,auVar245,auVar108);
      auVar114 = vmaxps_avx(auVar184,auVar108);
      auVar108 = vcmpps_avx(auVar165,auVar237,6);
      auVar108 = vorps_avx(auVar219,auVar108);
      auVar238._8_4_ = 0x7f800000;
      auVar238._0_8_ = 0x7f8000007f800000;
      auVar238._12_4_ = 0x7f800000;
      auVar238._16_4_ = 0x7f800000;
      auVar238._20_4_ = 0x7f800000;
      auVar238._24_4_ = 0x7f800000;
      auVar238._28_4_ = 0x7f800000;
      auVar108 = vblendvps_avx(auVar29,auVar238,auVar108);
      auVar165 = vminps_avx(auVar234,auVar108);
      fVar92 = -local_800._0_4_;
      fVar126 = -local_800._4_4_;
      fVar127 = -local_800._8_4_;
      fVar143 = -local_800._12_4_;
      fVar144 = -local_800._16_4_;
      fVar145 = -local_800._20_4_;
      fVar146 = -local_800._24_4_;
      auVar164._0_8_ = local_820._0_8_ ^ 0x8000000080000000;
      auVar164._8_4_ = -local_820._8_4_;
      auVar164._12_4_ = -local_820._12_4_;
      auVar164._16_4_ = -local_820._16_4_;
      auVar164._20_4_ = -local_820._20_4_;
      auVar164._24_4_ = -local_820._24_4_;
      auVar164._28_4_ = local_820._28_4_ ^ 0x80000000;
      auVar47 = ZEXT812(0);
      auVar240 = ZEXT1264(auVar47) << 0x20;
      auVar108 = vsubps_avx(ZEXT1232(auVar47) << 0x20,_local_7e0);
      auVar219 = vsubps_avx(ZEXT1232(auVar47) << 0x20,local_960);
      auVar30._4_4_ = auVar219._4_4_ * fVar126;
      auVar30._0_4_ = auVar219._0_4_ * fVar92;
      auVar30._8_4_ = auVar219._8_4_ * fVar127;
      auVar30._12_4_ = auVar219._12_4_ * fVar143;
      auVar30._16_4_ = auVar219._16_4_ * fVar144;
      auVar30._20_4_ = auVar219._20_4_ * fVar145;
      auVar30._24_4_ = auVar219._24_4_ * fVar146;
      auVar30._28_4_ = auVar219._28_4_;
      auVar9 = vfmadd231ps_fma(auVar30,auVar164,auVar108);
      auVar182._0_8_ = local_a60._0_8_ ^ 0x8000000080000000;
      auVar182._8_4_ = -local_a60._8_4_;
      auVar182._12_4_ = -local_a60._12_4_;
      auVar182._16_4_ = -local_a60._16_4_;
      auVar182._20_4_ = -local_a60._20_4_;
      auVar182._24_4_ = -local_a60._24_4_;
      auVar182._28_4_ = local_a60._28_4_ ^ 0x80000000;
      auVar108 = vsubps_avx(ZEXT1232(auVar47) << 0x20,auVar11);
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar182,auVar108);
      auVar31._4_4_ = fVar126 * fStack_67c;
      auVar31._0_4_ = fVar92 * local_680;
      auVar31._8_4_ = fVar127 * fStack_678;
      auVar31._12_4_ = fVar143 * fStack_674;
      auVar31._16_4_ = fVar144 * fStack_670;
      auVar31._20_4_ = fVar145 * fStack_66c;
      auVar31._24_4_ = fVar146 * fStack_668;
      auVar31._28_4_ = local_800._28_4_ ^ 0x80000000;
      auVar9 = vfmadd231ps_fma(auVar31,local_540,auVar164);
      auVar74 = vfmadd231ps_fma(ZEXT1632(auVar9),_local_560,auVar182);
      auVar108 = vandps_avx(local_6a0,ZEXT1632(auVar74));
      auVar135 = vrcpps_avx(ZEXT1632(auVar74));
      auVar212._8_4_ = 0x219392ef;
      auVar212._0_8_ = 0x219392ef219392ef;
      auVar212._12_4_ = 0x219392ef;
      auVar212._16_4_ = 0x219392ef;
      auVar212._20_4_ = 0x219392ef;
      auVar212._24_4_ = 0x219392ef;
      auVar212._28_4_ = 0x219392ef;
      auVar219 = vcmpps_avx(auVar108,auVar212,1);
      auVar229._8_4_ = 0x3f800000;
      auVar229._0_8_ = 0x3f8000003f800000;
      auVar229._12_4_ = 0x3f800000;
      auVar229._16_4_ = 0x3f800000;
      auVar229._20_4_ = 0x3f800000;
      auVar229._24_4_ = 0x3f800000;
      auVar229._28_4_ = 0x3f800000;
      auVar230 = ZEXT3264(auVar229);
      auVar184 = ZEXT1632(auVar74);
      auVar9 = vfnmadd213ps_fma(auVar135,auVar184,auVar229);
      auVar9 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar135,auVar135);
      auVar183._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
      auVar183._8_4_ = auVar74._8_4_ ^ 0x80000000;
      auVar183._12_4_ = auVar74._12_4_ ^ 0x80000000;
      auVar183._16_4_ = 0x80000000;
      auVar183._20_4_ = 0x80000000;
      auVar183._24_4_ = 0x80000000;
      auVar183._28_4_ = 0x80000000;
      auVar32._4_4_ = auVar9._4_4_ * -auVar7._4_4_;
      auVar32._0_4_ = auVar9._0_4_ * -auVar7._0_4_;
      auVar32._8_4_ = auVar9._8_4_ * -auVar7._8_4_;
      auVar32._12_4_ = auVar9._12_4_ * -auVar7._12_4_;
      auVar32._16_4_ = 0x80000000;
      auVar32._20_4_ = 0x80000000;
      auVar32._24_4_ = 0x80000000;
      auVar32._28_4_ = 0x80000000;
      auVar108 = vcmpps_avx(auVar184,auVar183,1);
      auVar108 = vorps_avx(auVar219,auVar108);
      auVar108 = vblendvps_avx(auVar32,auVar245,auVar108);
      local_880 = vmaxps_avx(auVar114,auVar108);
      auVar108 = vcmpps_avx(auVar184,auVar183,6);
      auVar108 = vorps_avx(auVar219,auVar108);
      auVar134._8_4_ = 0x7f800000;
      auVar134._0_8_ = 0x7f8000007f800000;
      auVar134._12_4_ = 0x7f800000;
      auVar134._16_4_ = 0x7f800000;
      auVar134._20_4_ = 0x7f800000;
      auVar134._24_4_ = 0x7f800000;
      auVar134._28_4_ = 0x7f800000;
      auVar219 = vblendvps_avx(auVar32,auVar134,auVar108);
      auVar108 = vandps_avx(local_340,local_600);
      local_4e0 = vminps_avx(auVar165,auVar219);
      auVar219 = vcmpps_avx(local_880,local_4e0,2);
      auVar114 = auVar108 & auVar219;
      if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar114 >> 0x7f,0) != '\0') ||
            (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar114 >> 0xbf,0) != '\0') ||
          (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar114[0x1f] < '\0') {
        auVar50._4_4_ = fStack_3dc;
        auVar50._0_4_ = local_3e0;
        auVar50._8_4_ = fStack_3d8;
        auVar50._12_4_ = fStack_3d4;
        auVar50._16_4_ = uStack_3d0;
        auVar50._20_4_ = uStack_3cc;
        auVar50._24_4_ = uStack_3c8;
        auVar50._28_4_ = fStack_3c4;
        auVar213._8_4_ = 0x3f800000;
        auVar213._0_8_ = 0x3f8000003f800000;
        auVar213._12_4_ = 0x3f800000;
        auVar213._16_4_ = 0x3f800000;
        auVar213._20_4_ = 0x3f800000;
        auVar213._24_4_ = 0x3f800000;
        auVar213._28_4_ = 0x3f800000;
        auVar114 = vminps_avx(auVar50,auVar213);
        auVar135 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar114 = vmaxps_avx(auVar114,ZEXT832(0) << 0x20);
        auVar49._4_4_ = fStack_3fc;
        auVar49._0_4_ = local_400;
        auVar49._8_4_ = fStack_3f8;
        auVar49._12_4_ = fStack_3f4;
        auVar49._16_4_ = uStack_3f0;
        auVar49._20_4_ = uStack_3ec;
        auVar49._24_4_ = uStack_3e8;
        auVar49._28_4_ = fStack_3e4;
        auVar165 = vminps_avx(auVar49,auVar213);
        auVar165 = vmaxps_avx(auVar165,ZEXT832(0) << 0x20);
        auVar33._4_4_ = (auVar114._4_4_ + 1.0) * 0.125;
        auVar33._0_4_ = (auVar114._0_4_ + 0.0) * 0.125;
        auVar33._8_4_ = (auVar114._8_4_ + 2.0) * 0.125;
        auVar33._12_4_ = (auVar114._12_4_ + 3.0) * 0.125;
        auVar33._16_4_ = (auVar114._16_4_ + 4.0) * 0.125;
        auVar33._20_4_ = (auVar114._20_4_ + 5.0) * 0.125;
        auVar33._24_4_ = (auVar114._24_4_ + 6.0) * 0.125;
        auVar33._28_4_ = auVar114._28_4_ + 7.0;
        auVar9 = vfmadd213ps_fma(auVar33,local_6e0,local_900);
        auVar34._4_4_ = (auVar165._4_4_ + 1.0) * 0.125;
        auVar34._0_4_ = (auVar165._0_4_ + 0.0) * 0.125;
        auVar34._8_4_ = (auVar165._8_4_ + 2.0) * 0.125;
        auVar34._12_4_ = (auVar165._12_4_ + 3.0) * 0.125;
        auVar34._16_4_ = (auVar165._16_4_ + 4.0) * 0.125;
        auVar34._20_4_ = (auVar165._20_4_ + 5.0) * 0.125;
        auVar34._24_4_ = (auVar165._24_4_ + 6.0) * 0.125;
        auVar34._28_4_ = auVar165._28_4_ + 7.0;
        auVar7 = vfmadd213ps_fma(auVar34,local_6e0,local_900);
        auVar114 = vminps_avx(local_700,local_720);
        auVar165 = vminps_avx(local_740,auVar12);
        auVar114 = vminps_avx(auVar114,auVar165);
        auVar233 = vsubps_avx(auVar114,auVar233);
        auVar108 = vandps_avx(auVar219,auVar108);
        local_1a0 = ZEXT1632(auVar9);
        local_1c0 = ZEXT1632(auVar7);
        auVar35._4_4_ = auVar233._4_4_ * 0.99999976;
        auVar35._0_4_ = auVar233._0_4_ * 0.99999976;
        auVar35._8_4_ = auVar233._8_4_ * 0.99999976;
        auVar35._12_4_ = auVar233._12_4_ * 0.99999976;
        auVar35._16_4_ = auVar233._16_4_ * 0.99999976;
        auVar35._20_4_ = auVar233._20_4_ * 0.99999976;
        auVar35._24_4_ = auVar233._24_4_ * 0.99999976;
        auVar35._28_4_ = 0x3f7ffffc;
        auVar219 = vmaxps_avx(ZEXT1232(auVar47) << 0x20,auVar35);
        auVar36._4_4_ = auVar219._4_4_ * auVar219._4_4_;
        auVar36._0_4_ = auVar219._0_4_ * auVar219._0_4_;
        auVar36._8_4_ = auVar219._8_4_ * auVar219._8_4_;
        auVar36._12_4_ = auVar219._12_4_ * auVar219._12_4_;
        auVar36._16_4_ = auVar219._16_4_ * auVar219._16_4_;
        auVar36._20_4_ = auVar219._20_4_ * auVar219._20_4_;
        auVar36._24_4_ = auVar219._24_4_ * auVar219._24_4_;
        auVar36._28_4_ = auVar219._28_4_;
        auVar233 = vsubps_avx(auVar10,auVar36);
        auVar37._4_4_ = auVar233._4_4_ * fVar123 * 4.0;
        auVar37._0_4_ = auVar233._0_4_ * fVar122 * 4.0;
        auVar37._8_4_ = auVar233._8_4_ * fVar188 * 4.0;
        auVar37._12_4_ = auVar233._12_4_ * fVar202 * 4.0;
        auVar37._16_4_ = auVar233._16_4_ * fVar203 * 4.0;
        auVar37._20_4_ = auVar233._20_4_ * fVar204 * 4.0;
        auVar37._24_4_ = auVar233._24_4_ * fVar205 * 4.0;
        auVar37._28_4_ = auVar219._28_4_;
        auVar219 = vsubps_avx(auVar23,auVar37);
        local_8a0 = vcmpps_avx(auVar219,ZEXT832(0) << 0x20,5);
        auVar242 = ZEXT3264(local_8a0);
        if ((((((((local_8a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_8a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_8a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_8a0 >> 0x7f,0) == '\0') &&
              (local_8a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_8a0 >> 0xbf,0) == '\0') &&
            (local_8a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_8a0[0x1f]) {
          auVar184 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar113 = ZEXT1232(ZEXT412(0)) << 0x20;
          _local_ae0 = ZEXT1228(ZEXT412(0)) << 0x20;
          auVar165 = SUB6432(ZEXT864(0),0) << 0x20;
          _local_b00 = SUB3228(ZEXT832(0),0) << 0x20;
          auVar214._8_4_ = 0x7f800000;
          auVar214._0_8_ = 0x7f8000007f800000;
          auVar214._12_4_ = 0x7f800000;
          auVar214._16_4_ = 0x7f800000;
          auVar214._20_4_ = 0x7f800000;
          auVar214._24_4_ = 0x7f800000;
          auVar214._28_4_ = 0x7f800000;
          auVar221._8_4_ = 0xff800000;
          auVar221._0_8_ = 0xff800000ff800000;
          auVar221._12_4_ = 0xff800000;
          auVar221._16_4_ = 0xff800000;
          auVar221._20_4_ = 0xff800000;
          auVar221._24_4_ = 0xff800000;
          auVar221._28_4_ = 0xff800000;
          local_8a0 = auVar11;
        }
        else {
          auVar114 = vrcpps_avx(local_320);
          auVar136._8_4_ = 0x3f800000;
          auVar136._0_8_ = 0x3f8000003f800000;
          auVar136._12_4_ = 0x3f800000;
          auVar136._16_4_ = 0x3f800000;
          auVar136._20_4_ = 0x3f800000;
          auVar136._24_4_ = 0x3f800000;
          auVar136._28_4_ = 0x3f800000;
          auVar9 = vfnmadd213ps_fma(local_320,auVar114,auVar136);
          auVar9 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar114,auVar114);
          auVar114 = vsqrtps_avx(auVar219);
          auVar137._0_8_ = CONCAT44(fVar207,fVar206) ^ 0x8000000080000000;
          auVar137._8_4_ = -local_300._8_4_;
          auVar137._12_4_ = -local_300._12_4_;
          auVar137._16_4_ = -local_300._16_4_;
          auVar137._20_4_ = -local_300._20_4_;
          auVar137._24_4_ = -local_300._24_4_;
          auVar137._28_4_ = -local_300._28_4_;
          auVar165 = vsubps_avx(auVar137,auVar114);
          auVar114 = vsubps_avx(auVar114,local_300);
          auVar199._0_4_ = auVar165._0_4_ * auVar9._0_4_;
          auVar199._4_4_ = auVar165._4_4_ * auVar9._4_4_;
          auVar199._8_4_ = auVar165._8_4_ * auVar9._8_4_;
          auVar199._12_4_ = auVar165._12_4_ * auVar9._12_4_;
          auVar199._16_4_ = auVar165._16_4_ * 0.0;
          auVar199._20_4_ = auVar165._20_4_ * 0.0;
          auVar199._24_4_ = auVar165._24_4_ * 0.0;
          auVar199._28_4_ = 0;
          fVar92 = auVar114._0_4_ * auVar9._0_4_;
          fVar122 = auVar114._4_4_ * auVar9._4_4_;
          auVar38._4_4_ = fVar122;
          auVar38._0_4_ = fVar92;
          fVar123 = auVar114._8_4_ * auVar9._8_4_;
          auVar38._8_4_ = fVar123;
          fVar188 = auVar114._12_4_ * auVar9._12_4_;
          auVar38._12_4_ = fVar188;
          fVar202 = auVar114._16_4_ * 0.0;
          auVar38._16_4_ = fVar202;
          fVar203 = auVar114._20_4_ * 0.0;
          auVar38._20_4_ = fVar203;
          fVar204 = auVar114._24_4_ * 0.0;
          auVar38._24_4_ = fVar204;
          auVar38._28_4_ = local_880._28_4_;
          auVar9 = vfmadd213ps_fma(auVar220,auVar199,auVar258);
          auVar7 = vfmadd213ps_fma(auVar220,auVar38,auVar258);
          auVar39._28_4_ = auVar165._28_4_;
          auVar39._0_28_ =
               ZEXT1628(CONCAT412(fVar124 * auVar9._12_4_,
                                  CONCAT48(fVar125 * auVar9._8_4_,
                                           CONCAT44(fVar121 * auVar9._4_4_,fVar120 * auVar9._0_4_)))
                       );
          auVar114 = ZEXT1632(CONCAT412(fVar124 * auVar7._12_4_,
                                        CONCAT48(fVar125 * auVar7._8_4_,
                                                 CONCAT44(fVar121 * auVar7._4_4_,
                                                          fVar120 * auVar7._0_4_))));
          auVar9 = vfmadd213ps_fma(local_2a0,auVar39,auVar179);
          auVar7 = vfmadd213ps_fma(local_2a0,auVar114,auVar179);
          auVar74 = vfmadd213ps_fma(local_2c0,auVar39,auVar260);
          auVar195 = vfmadd213ps_fma(local_2c0,auVar114,auVar260);
          auVar78 = vfmadd213ps_fma(auVar39,auVar113,auVar162);
          auVar70 = vfmadd213ps_fma(auVar113,auVar114,auVar162);
          auVar40._4_4_ = (float)local_560._4_4_ * auVar199._4_4_;
          auVar40._0_4_ = (float)local_560._0_4_ * auVar199._0_4_;
          auVar40._8_4_ = fStack_558 * auVar199._8_4_;
          auVar40._12_4_ = fStack_554 * auVar199._12_4_;
          auVar40._16_4_ = fStack_550 * auVar199._16_4_;
          auVar40._20_4_ = fStack_54c * auVar199._20_4_;
          auVar40._24_4_ = fStack_548 * auVar199._24_4_;
          auVar40._28_4_ = 0;
          auVar113 = vsubps_avx(auVar40,ZEXT1632(auVar9));
          auVar240 = ZEXT3264(local_540);
          auVar166._0_4_ = local_540._0_4_ * auVar199._0_4_;
          auVar166._4_4_ = local_540._4_4_ * auVar199._4_4_;
          auVar166._8_4_ = local_540._8_4_ * auVar199._8_4_;
          auVar166._12_4_ = local_540._12_4_ * auVar199._12_4_;
          auVar166._16_4_ = local_540._16_4_ * auVar199._16_4_;
          auVar166._20_4_ = local_540._20_4_ * auVar199._20_4_;
          auVar166._24_4_ = local_540._24_4_ * auVar199._24_4_;
          auVar166._28_4_ = 0;
          auVar165 = vsubps_avx(auVar166,ZEXT1632(auVar74));
          auVar185._0_4_ = local_680 * auVar199._0_4_;
          auVar185._4_4_ = fStack_67c * auVar199._4_4_;
          auVar185._8_4_ = fStack_678 * auVar199._8_4_;
          auVar185._12_4_ = fStack_674 * auVar199._12_4_;
          auVar185._16_4_ = fStack_670 * auVar199._16_4_;
          auVar185._20_4_ = fStack_66c * auVar199._20_4_;
          auVar185._24_4_ = fStack_668 * auVar199._24_4_;
          auVar185._28_4_ = 0;
          auVar114 = vsubps_avx(auVar185,ZEXT1632(auVar78));
          _local_b00 = auVar114._0_28_;
          auVar41._4_4_ = fVar122 * (float)local_560._4_4_;
          auVar41._0_4_ = fVar92 * (float)local_560._0_4_;
          auVar41._8_4_ = fVar123 * fStack_558;
          auVar41._12_4_ = fVar188 * fStack_554;
          auVar41._16_4_ = fVar202 * fStack_550;
          auVar41._20_4_ = fVar203 * fStack_54c;
          auVar41._24_4_ = fVar204 * fStack_548;
          auVar41._28_4_ = auVar114._28_4_;
          auVar135 = vsubps_avx(auVar41,ZEXT1632(auVar7));
          auVar42._4_4_ = local_540._4_4_ * fVar122;
          auVar42._0_4_ = local_540._0_4_ * fVar92;
          auVar42._8_4_ = local_540._8_4_ * fVar123;
          auVar42._12_4_ = local_540._12_4_ * fVar188;
          auVar42._16_4_ = local_540._16_4_ * fVar202;
          auVar42._20_4_ = local_540._20_4_ * fVar203;
          auVar42._24_4_ = local_540._24_4_ * fVar204;
          auVar42._28_4_ = 0;
          auVar184 = vsubps_avx(auVar42,ZEXT1632(auVar195));
          auVar43._4_4_ = fVar122 * fStack_67c;
          auVar43._0_4_ = fVar92 * local_680;
          auVar43._8_4_ = fVar123 * fStack_678;
          auVar43._12_4_ = fVar188 * fStack_674;
          auVar43._16_4_ = fVar202 * fStack_670;
          auVar43._20_4_ = fVar203 * fStack_66c;
          auVar43._24_4_ = fVar204 * fStack_668;
          auVar43._28_4_ = local_560._28_4_;
          auVar114 = vsubps_avx(auVar43,ZEXT1632(auVar70));
          _local_ae0 = auVar114._0_28_;
          auVar114 = vcmpps_avx(auVar219,_DAT_01f7b000,5);
          auVar215._8_4_ = 0x7f800000;
          auVar215._0_8_ = 0x7f8000007f800000;
          auVar215._12_4_ = 0x7f800000;
          auVar215._16_4_ = 0x7f800000;
          auVar215._20_4_ = 0x7f800000;
          auVar215._24_4_ = 0x7f800000;
          auVar215._28_4_ = 0x7f800000;
          auVar214 = vblendvps_avx(auVar215,auVar199,auVar114);
          auVar219 = vandps_avx(local_6a0,local_2e0);
          auVar219 = vmaxps_avx(local_480,auVar219);
          auVar44._4_4_ = auVar219._4_4_ * 1.9073486e-06;
          auVar44._0_4_ = auVar219._0_4_ * 1.9073486e-06;
          auVar44._8_4_ = auVar219._8_4_ * 1.9073486e-06;
          auVar44._12_4_ = auVar219._12_4_ * 1.9073486e-06;
          auVar44._16_4_ = auVar219._16_4_ * 1.9073486e-06;
          auVar44._20_4_ = auVar219._20_4_ * 1.9073486e-06;
          auVar44._24_4_ = auVar219._24_4_ * 1.9073486e-06;
          auVar44._28_4_ = auVar219._28_4_;
          auVar219 = vandps_avx(local_6a0,local_620);
          auVar219 = vcmpps_avx(auVar219,auVar44,1);
          auVar222._8_4_ = 0xff800000;
          auVar222._0_8_ = 0xff800000ff800000;
          auVar222._12_4_ = 0xff800000;
          auVar222._16_4_ = 0xff800000;
          auVar222._20_4_ = 0xff800000;
          auVar222._24_4_ = 0xff800000;
          auVar222._28_4_ = 0xff800000;
          auVar221 = vblendvps_avx(auVar222,auVar38,auVar114);
          auVar10 = auVar114 & auVar219;
          if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar10 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar10 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar10 >> 0x7f,0) == '\0') &&
                (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar10 >> 0xbf,0) == '\0') &&
              (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar10[0x1f]) {
            auVar242 = ZEXT3264(local_8a0);
          }
          else {
            auVar219 = vandps_avx(auVar114,auVar219);
            auVar10 = vcmpps_avx(auVar233,_DAT_01f7b000,2);
            auVar239._8_4_ = 0xff800000;
            auVar239._0_8_ = 0xff800000ff800000;
            auVar239._12_4_ = 0xff800000;
            auVar239._16_4_ = 0xff800000;
            auVar239._20_4_ = 0xff800000;
            auVar239._24_4_ = 0xff800000;
            auVar239._28_4_ = 0xff800000;
            auVar240 = ZEXT3264(auVar239);
            auVar264._8_4_ = 0x7f800000;
            auVar264._0_8_ = 0x7f8000007f800000;
            auVar264._12_4_ = 0x7f800000;
            auVar264._16_4_ = 0x7f800000;
            auVar264._20_4_ = 0x7f800000;
            auVar264._24_4_ = 0x7f800000;
            auVar264._28_4_ = 0x7f800000;
            auVar233 = vblendvps_avx(auVar264,auVar239,auVar10);
            auVar9 = vpackssdw_avx(auVar219._0_16_,auVar219._16_16_);
            auVar11 = vpmovsxwd_avx2(auVar9);
            auVar214 = vblendvps_avx(auVar214,auVar233,auVar11);
            auVar233 = vblendvps_avx(auVar239,auVar264,auVar10);
            auVar221 = vblendvps_avx(auVar221,auVar233,auVar11);
            auVar201._0_8_ = auVar219._0_8_ ^ 0xffffffffffffffff;
            auVar201._8_4_ = auVar219._8_4_ ^ 0xffffffff;
            auVar201._12_4_ = auVar219._12_4_ ^ 0xffffffff;
            auVar201._16_4_ = auVar219._16_4_ ^ 0xffffffff;
            auVar201._20_4_ = auVar219._20_4_ ^ 0xffffffff;
            auVar201._24_4_ = auVar219._24_4_ ^ 0xffffffff;
            auVar201._28_4_ = auVar219._28_4_ ^ 0xffffffff;
            auVar219 = vorps_avx(auVar10,auVar201);
            auVar219 = vandps_avx(auVar114,auVar219);
            auVar242 = ZEXT3264(auVar219);
          }
        }
        uVar62 = *(undefined4 *)&(ray->dir).field_0;
        auVar200._4_4_ = uVar62;
        auVar200._0_4_ = uVar62;
        auVar200._8_4_ = uVar62;
        auVar200._12_4_ = uVar62;
        auVar200._16_4_ = uVar62;
        auVar200._20_4_ = uVar62;
        auVar200._24_4_ = uVar62;
        auVar200._28_4_ = uVar62;
        uVar62 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
        auVar246._4_4_ = uVar62;
        auVar246._0_4_ = uVar62;
        auVar246._8_4_ = uVar62;
        auVar246._12_4_ = uVar62;
        auVar246._16_4_ = uVar62;
        auVar246._20_4_ = uVar62;
        auVar246._24_4_ = uVar62;
        auVar246._28_4_ = uVar62;
        fVar92 = (ray->dir).field_0.m128[2];
        local_4c0 = local_880;
        local_4a0 = vminps_avx(local_4e0,auVar214);
        _local_760 = vmaxps_avx(local_880,auVar221);
        auVar230 = ZEXT3264(_local_760);
        _local_500 = _local_760;
        auVar219 = vcmpps_avx(local_880,local_4a0,2);
        local_580 = vandps_avx(auVar108,auVar219);
        auVar219 = vcmpps_avx(_local_760,local_4e0,2);
        local_7a0 = vandps_avx(auVar108,auVar219);
        auVar108 = vorps_avx(local_7a0,local_580);
        auVar224 = ZEXT3264(local_a20);
        if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar108 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar108 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar108 >> 0x7f,0) != '\0') ||
              (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar108 >> 0xbf,0) != '\0') ||
            (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar108[0x1f] < '\0') {
          auVar45._4_4_ = fVar92 * (float)local_ae0._4_4_;
          auVar45._0_4_ = fVar92 * (float)local_ae0._0_4_;
          auVar45._8_4_ = fVar92 * fStack_ad8;
          auVar45._12_4_ = fVar92 * fStack_ad4;
          auVar45._16_4_ = fVar92 * fStack_ad0;
          auVar45._20_4_ = fVar92 * fStack_acc;
          auVar45._24_4_ = fVar92 * fStack_ac8;
          auVar45._28_4_ = auVar108._28_4_;
          auVar9 = vfmadd213ps_fma(auVar184,auVar246,auVar45);
          auVar46._4_4_ = fVar92 * (float)local_b00._4_4_;
          auVar46._0_4_ = fVar92 * (float)local_b00._0_4_;
          auVar46._8_4_ = fVar92 * fStack_af8;
          auVar46._12_4_ = fVar92 * fStack_af4;
          auVar46._16_4_ = fVar92 * fStack_af0;
          auVar46._20_4_ = fVar92 * fStack_aec;
          auVar46._24_4_ = fVar92 * fStack_ae8;
          auVar46._28_4_ = auVar108._28_4_;
          auVar7 = vfmadd213ps_fma(auVar165,auVar246,auVar46);
          auVar9 = vfmadd213ps_fma(auVar135,auVar200,ZEXT1632(auVar9));
          auVar86._0_8_ = auVar242._0_8_ ^ 0xffffffffffffffff;
          auVar86._8_4_ = auVar242._8_4_ ^ 0xffffffff;
          auVar86._12_4_ = auVar242._12_4_ ^ 0xffffffff;
          auVar86._16_4_ = auVar242._16_4_ ^ 0xffffffff;
          auVar86._20_4_ = auVar242._20_4_ ^ 0xffffffff;
          auVar86._24_4_ = auVar242._24_4_ ^ 0xffffffff;
          auVar86._28_4_ = auVar242._28_4_ ^ 0xffffffff;
          auVar108 = vandps_avx(ZEXT1632(auVar9),local_6a0);
          auVar186._8_4_ = 0x3e99999a;
          auVar186._0_8_ = 0x3e99999a3e99999a;
          auVar186._12_4_ = 0x3e99999a;
          auVar186._16_4_ = 0x3e99999a;
          auVar186._20_4_ = 0x3e99999a;
          auVar186._24_4_ = 0x3e99999a;
          auVar186._28_4_ = 0x3e99999a;
          auVar108 = vcmpps_avx(auVar108,auVar186,1);
          local_5c0 = vorps_avx(auVar108,auVar86);
          auVar9 = vfmadd213ps_fma(auVar113,auVar200,ZEXT1632(auVar7));
          auVar108 = vandps_avx(ZEXT1632(auVar9),local_6a0);
          auVar108 = vcmpps_avx(auVar108,auVar186,1);
          auVar108 = vorps_avx(auVar108,auVar86);
          auVar117._8_4_ = 3;
          auVar117._0_8_ = 0x300000003;
          auVar117._12_4_ = 3;
          auVar117._16_4_ = 3;
          auVar117._20_4_ = 3;
          auVar117._24_4_ = 3;
          auVar117._28_4_ = 3;
          auVar139._8_4_ = 2;
          auVar139._0_8_ = 0x200000002;
          auVar139._12_4_ = 2;
          auVar139._16_4_ = 2;
          auVar139._20_4_ = 2;
          auVar139._24_4_ = 2;
          auVar139._28_4_ = 2;
          auVar108 = vblendvps_avx(auVar139,auVar117,auVar108);
          local_5e0._4_4_ = local_b04;
          local_5e0._0_4_ = local_b04;
          local_5e0._8_4_ = local_b04;
          local_5e0._12_4_ = local_b04;
          local_5e0._16_4_ = local_b04;
          local_5e0._20_4_ = local_b04;
          local_5e0._24_4_ = local_b04;
          local_5e0._28_4_ = local_b04;
          local_5a0 = vpcmpgtd_avx2(auVar108,local_5e0);
          auVar108 = vpandn_avx2(local_5a0,local_580);
          local_780._4_4_ = local_880._4_4_ + (float)local_660._4_4_;
          local_780._0_4_ = local_880._0_4_ + (float)local_660._0_4_;
          fStack_778 = local_880._8_4_ + fStack_658;
          fStack_774 = local_880._12_4_ + fStack_654;
          fStack_770 = local_880._16_4_ + fStack_650;
          fStack_76c = local_880._20_4_ + fStack_64c;
          fStack_768 = local_880._24_4_ + fStack_648;
          fStack_764 = local_880._28_4_ + fStack_644;
          while( true ) {
            local_420 = auVar108;
            if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar108 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar108 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar108 >> 0x7f,0) == '\0') &&
                  (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar108 >> 0xbf,0) == '\0') &&
                (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar108[0x1f]) break;
            auVar118._8_4_ = 0x7f800000;
            auVar118._0_8_ = 0x7f8000007f800000;
            auVar118._12_4_ = 0x7f800000;
            auVar118._16_4_ = 0x7f800000;
            auVar118._20_4_ = 0x7f800000;
            auVar118._24_4_ = 0x7f800000;
            auVar118._28_4_ = 0x7f800000;
            auVar219 = vblendvps_avx(auVar118,local_880,auVar108);
            auVar233 = vshufps_avx(auVar219,auVar219,0xb1);
            auVar233 = vminps_avx(auVar219,auVar233);
            auVar114 = vshufpd_avx(auVar233,auVar233,5);
            auVar233 = vminps_avx(auVar233,auVar114);
            auVar114 = vpermpd_avx2(auVar233,0x4e);
            auVar233 = vminps_avx(auVar233,auVar114);
            auVar219 = vcmpps_avx(auVar219,auVar233,0);
            auVar233 = auVar108 & auVar219;
            if ((((((((auVar233 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar233 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar233 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar233 >> 0x7f,0) != '\0') ||
                  (auVar233 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar233 >> 0xbf,0) != '\0') ||
                (auVar233 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar233[0x1f] < '\0') {
              auVar108 = vandps_avx(auVar219,auVar108);
            }
            uVar56 = vmovmskps_avx(auVar108);
            iVar13 = 0;
            for (; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x80000000) {
              iVar13 = iVar13 + 1;
            }
            uVar61 = (ulong)(uint)(iVar13 << 2);
            *(undefined4 *)(local_420 + uVar61) = 0;
            aVar1 = (ray->dir).field_0;
            local_860._0_16_ = (undefined1  [16])aVar1;
            auVar9 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            uVar56 = *(uint *)(local_1a0 + uVar61);
            uVar60 = *(uint *)(local_4c0 + uVar61);
            if (auVar9._0_4_ < 0.0) {
              auVar242 = ZEXT1664(auVar242._0_16_);
              fVar92 = sqrtf(auVar9._0_4_);
              auVar224 = ZEXT3264(local_a20);
              uVar61 = extraout_RAX;
            }
            else {
              auVar9 = vsqrtss_avx(auVar9,auVar9);
              fVar92 = auVar9._0_4_;
            }
            auVar7 = vminps_avx(local_9c0,local_9e0);
            auVar9 = vmaxps_avx(local_9c0,local_9e0);
            auVar74 = vminps_avx(local_9d0,_local_9f0);
            auVar195 = vminps_avx(auVar7,auVar74);
            auVar7 = vmaxps_avx(local_9d0,_local_9f0);
            auVar74 = vmaxps_avx(auVar9,auVar7);
            auVar9 = vandps_avx(auVar195,local_a00);
            auVar7 = vandps_avx(auVar74,local_a00);
            auVar9 = vmaxps_avx(auVar9,auVar7);
            auVar7 = vmovshdup_avx(auVar9);
            auVar7 = vmaxss_avx(auVar7,auVar9);
            auVar9 = vshufpd_avx(auVar9,auVar9,1);
            auVar9 = vmaxss_avx(auVar9,auVar7);
            local_8a0._0_4_ = auVar9._0_4_ * 1.9073486e-06;
            local_800._0_4_ = fVar92 * 1.9073486e-06;
            local_740._0_16_ = vshufps_avx(auVar74,auVar74,0xff);
            auVar9 = vinsertps_avx(ZEXT416(uVar60),ZEXT416(uVar56),0x10);
            uVar64 = 0;
            while( true ) {
              bVar55 = (byte)uVar61;
              if (uVar64 == 5) break;
              local_960._0_16_ = vmovshdup_avx(auVar9);
              fVar125 = 1.0 - local_960._0_4_;
              auVar7 = vshufps_avx(auVar9,auVar9,0x55);
              fVar92 = auVar7._0_4_;
              auVar96._0_4_ = local_9e0._0_4_ * fVar92;
              fVar120 = auVar7._4_4_;
              auVar96._4_4_ = local_9e0._4_4_ * fVar120;
              fVar121 = auVar7._8_4_;
              auVar96._8_4_ = local_9e0._8_4_ * fVar121;
              fVar122 = auVar7._12_4_;
              auVar96._12_4_ = local_9e0._12_4_ * fVar122;
              auVar128._4_4_ = fVar125;
              auVar128._0_4_ = fVar125;
              auVar128._8_4_ = fVar125;
              auVar128._12_4_ = fVar125;
              auVar7 = vfmadd231ps_fma(auVar96,auVar128,local_9c0);
              auVar148._0_4_ = local_9d0._0_4_ * fVar92;
              auVar148._4_4_ = local_9d0._4_4_ * fVar120;
              auVar148._8_4_ = local_9d0._8_4_ * fVar121;
              auVar148._12_4_ = local_9d0._12_4_ * fVar122;
              auVar74 = vfmadd231ps_fma(auVar148,auVar128,local_9e0);
              auVar194._0_4_ = fVar92 * auVar74._0_4_;
              auVar194._4_4_ = fVar120 * auVar74._4_4_;
              auVar194._8_4_ = fVar121 * auVar74._8_4_;
              auVar194._12_4_ = fVar122 * auVar74._12_4_;
              auVar195 = vfmadd231ps_fma(auVar194,auVar128,auVar7);
              auVar97._0_4_ = fVar92 * (float)local_9f0._0_4_;
              auVar97._4_4_ = fVar120 * (float)local_9f0._4_4_;
              auVar97._8_4_ = fVar121 * fStack_9e8;
              auVar97._12_4_ = fVar122 * fStack_9e4;
              auVar7 = vfmadd231ps_fma(auVar97,auVar128,local_9d0);
              auVar173._0_4_ = fVar92 * auVar7._0_4_;
              auVar173._4_4_ = fVar120 * auVar7._4_4_;
              auVar173._8_4_ = fVar121 * auVar7._8_4_;
              auVar173._12_4_ = fVar122 * auVar7._12_4_;
              local_a60._0_16_ = vfmadd231ps_fma(auVar173,auVar128,auVar74);
              fVar123 = auVar9._0_4_;
              auVar98._4_4_ = fVar123;
              auVar98._0_4_ = fVar123;
              auVar98._8_4_ = fVar123;
              auVar98._12_4_ = fVar123;
              auVar7 = vfmadd213ps_fma(auVar98,local_860._0_16_,_DAT_01f45a50);
              auVar73._0_4_ = fVar92 * local_a60._0_4_;
              auVar73._4_4_ = fVar120 * local_a60._4_4_;
              auVar73._8_4_ = fVar121 * local_a60._8_4_;
              auVar73._12_4_ = fVar122 * local_a60._12_4_;
              auVar74 = vfmadd231ps_fma(auVar73,auVar195,auVar128);
              local_6c0._0_16_ = auVar74;
              auVar7 = vsubps_avx(auVar7,auVar74);
              _local_7e0 = auVar7;
              auVar7 = vdpps_avx(auVar7,auVar7,0x7f);
              fVar92 = auVar7._0_4_;
              if (fVar92 < 0.0) {
                local_980._0_16_ = ZEXT416((uint)fVar125);
                local_a40._0_16_ = auVar195;
                auVar249._0_4_ = sqrtf(fVar92);
                auVar249._4_60_ = extraout_var;
                auVar74 = auVar249._0_16_;
                uVar61 = extraout_RAX_00;
                auVar195 = local_a40._0_16_;
                auVar78 = local_980._0_16_;
              }
              else {
                auVar74 = vsqrtss_avx(auVar7,auVar7);
                auVar78 = ZEXT416((uint)fVar125);
              }
              auVar195 = vsubps_avx(local_a60._0_16_,auVar195);
              auVar209._0_4_ = auVar195._0_4_ * 3.0;
              auVar209._4_4_ = auVar195._4_4_ * 3.0;
              auVar209._8_4_ = auVar195._8_4_ * 3.0;
              auVar209._12_4_ = auVar195._12_4_ * 3.0;
              auVar195 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar78,local_960._0_16_);
              auVar70 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_960._0_16_,auVar78);
              fVar120 = auVar78._0_4_ * 6.0;
              fVar121 = auVar195._0_4_ * 6.0;
              fVar122 = auVar70._0_4_ * 6.0;
              fVar125 = local_960._0_4_ * 6.0;
              auVar149._0_4_ = fVar125 * (float)local_9f0._0_4_;
              auVar149._4_4_ = fVar125 * (float)local_9f0._4_4_;
              auVar149._8_4_ = fVar125 * fStack_9e8;
              auVar149._12_4_ = fVar125 * fStack_9e4;
              auVar99._4_4_ = fVar122;
              auVar99._0_4_ = fVar122;
              auVar99._8_4_ = fVar122;
              auVar99._12_4_ = fVar122;
              auVar195 = vfmadd132ps_fma(auVar99,auVar149,local_9d0);
              auVar150._4_4_ = fVar121;
              auVar150._0_4_ = fVar121;
              auVar150._8_4_ = fVar121;
              auVar150._12_4_ = fVar121;
              auVar195 = vfmadd132ps_fma(auVar150,auVar195,local_9e0);
              auVar78 = vdpps_avx(auVar209,auVar209,0x7f);
              auVar100._4_4_ = fVar120;
              auVar100._0_4_ = fVar120;
              auVar100._8_4_ = fVar120;
              auVar100._12_4_ = fVar120;
              auVar69 = vfmadd132ps_fma(auVar100,auVar195,local_9c0);
              auVar195 = vblendps_avx(auVar78,_DAT_01f45a50,0xe);
              auVar70 = vrsqrtss_avx(auVar195,auVar195);
              fVar122 = auVar78._0_4_;
              fVar120 = auVar70._0_4_;
              auVar70 = vdpps_avx(auVar209,auVar69,0x7f);
              fVar120 = fVar120 * 1.5 + fVar122 * -0.5 * fVar120 * fVar120 * fVar120;
              auVar101._0_4_ = auVar69._0_4_ * fVar122;
              auVar101._4_4_ = auVar69._4_4_ * fVar122;
              auVar101._8_4_ = auVar69._8_4_ * fVar122;
              auVar101._12_4_ = auVar69._12_4_ * fVar122;
              fVar121 = auVar70._0_4_;
              auVar196._0_4_ = auVar209._0_4_ * fVar121;
              auVar196._4_4_ = auVar209._4_4_ * fVar121;
              auVar196._8_4_ = auVar209._8_4_ * fVar121;
              auVar196._12_4_ = auVar209._12_4_ * fVar121;
              auVar70 = vsubps_avx(auVar101,auVar196);
              auVar195 = vrcpss_avx(auVar195,auVar195);
              auVar69 = vfnmadd213ss_fma(auVar195,auVar78,ZEXT416(0x40000000));
              fVar121 = auVar195._0_4_ * auVar69._0_4_;
              auVar195 = vmaxss_avx(ZEXT416((uint)local_8a0._0_4_),
                                    ZEXT416((uint)(fVar123 * (float)local_800._0_4_)));
              auVar224 = ZEXT1664(auVar195);
              uVar48 = CONCAT44(auVar209._4_4_,auVar209._0_4_);
              local_a60._0_8_ = uVar48 ^ 0x8000000080000000;
              local_a60._8_4_ = -auVar209._8_4_;
              local_a60._12_4_ = -auVar209._12_4_;
              auVar151._0_4_ = fVar120 * auVar70._0_4_ * fVar121;
              auVar151._4_4_ = fVar120 * auVar70._4_4_ * fVar121;
              auVar151._8_4_ = fVar120 * auVar70._8_4_ * fVar121;
              auVar151._12_4_ = fVar120 * auVar70._12_4_ * fVar121;
              auVar227._0_4_ = auVar209._0_4_ * fVar120;
              auVar227._4_4_ = auVar209._4_4_ * fVar120;
              auVar227._8_4_ = auVar209._8_4_ * fVar120;
              auVar227._12_4_ = auVar209._12_4_ * fVar120;
              local_960._0_16_ = auVar209;
              local_980._0_4_ = auVar195._0_4_;
              if (fVar122 < -fVar122) {
                local_a40._0_4_ = auVar74._0_4_;
                local_820._0_16_ = auVar227;
                local_900._0_16_ = auVar151;
                fVar120 = sqrtf(fVar122);
                auVar74 = ZEXT416((uint)local_a40._0_4_);
                auVar224 = ZEXT464((uint)local_980._0_4_);
                uVar61 = extraout_RAX_01;
                auVar151 = local_900._0_16_;
                auVar227 = local_820._0_16_;
              }
              else {
                auVar195 = vsqrtss_avx(auVar78,auVar78);
                fVar120 = auVar195._0_4_;
              }
              auVar195 = vdpps_avx(_local_7e0,auVar227,0x7f);
              auVar129 = vfmadd213ss_fma(ZEXT416((uint)local_8a0._0_4_),auVar74,auVar224._0_16_);
              auVar78 = vdpps_avx(local_a60._0_16_,auVar227,0x7f);
              auVar70 = vdpps_avx(_local_7e0,auVar151,0x7f);
              auVar69 = vdpps_avx(local_860._0_16_,auVar227,0x7f);
              auVar74 = vfmadd213ss_fma(ZEXT416((uint)(auVar74._0_4_ + 1.0)),
                                        ZEXT416((uint)((float)local_8a0._0_4_ / fVar120)),auVar129);
              local_a40._0_4_ = auVar74._0_4_;
              auVar75._0_4_ = auVar195._0_4_ * auVar195._0_4_;
              auVar75._4_4_ = auVar195._4_4_ * auVar195._4_4_;
              auVar75._8_4_ = auVar195._8_4_ * auVar195._8_4_;
              auVar75._12_4_ = auVar195._12_4_ * auVar195._12_4_;
              auVar74 = vdpps_avx(_local_7e0,local_a60._0_16_,0x7f);
              auVar94 = vsubps_avx(auVar7,auVar75);
              auVar129 = vrsqrtss_avx(auVar94,auVar94);
              fVar121 = auVar94._0_4_;
              fVar120 = auVar129._0_4_;
              fVar120 = fVar120 * 1.5 + fVar121 * -0.5 * fVar120 * fVar120 * fVar120;
              auVar129 = vdpps_avx(_local_7e0,local_860._0_16_,0x7f);
              local_a60._0_16_ = ZEXT416((uint)(auVar78._0_4_ + auVar70._0_4_));
              auVar74 = vfnmadd231ss_fma(auVar74,auVar195,local_a60._0_16_);
              auVar78 = vfnmadd231ss_fma(auVar129,auVar195,auVar69);
              if (fVar121 < 0.0) {
                local_820._0_16_ = auVar195;
                local_900._0_16_ = auVar69;
                local_6e0._0_16_ = auVar74;
                local_700._0_4_ = fVar120;
                local_720._0_16_ = auVar78;
                fVar121 = sqrtf(fVar121);
                auVar224 = ZEXT464((uint)local_980._0_4_);
                uVar61 = extraout_RAX_02;
                fVar120 = (float)local_700._0_4_;
                auVar78 = local_720._0_16_;
                auVar74 = local_6e0._0_16_;
                auVar69 = local_900._0_16_;
                auVar195 = local_820._0_16_;
              }
              else {
                auVar70 = vsqrtss_avx(auVar94,auVar94);
                fVar121 = auVar70._0_4_;
              }
              auVar242 = ZEXT1664(auVar7);
              auVar70 = vpermilps_avx(local_6c0._0_16_,0xff);
              fVar121 = fVar121 - auVar70._0_4_;
              auVar70 = vshufps_avx(local_960._0_16_,local_960._0_16_,0xff);
              auVar74 = vfmsub213ss_fma(auVar74,ZEXT416((uint)fVar120),auVar70);
              auVar152._0_8_ = auVar69._0_8_ ^ 0x8000000080000000;
              auVar152._8_4_ = auVar69._8_4_ ^ 0x80000000;
              auVar152._12_4_ = auVar69._12_4_ ^ 0x80000000;
              auVar174._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
              auVar174._8_4_ = auVar74._8_4_ ^ 0x80000000;
              auVar174._12_4_ = auVar74._12_4_ ^ 0x80000000;
              auVar129 = ZEXT416((uint)(auVar78._0_4_ * fVar120));
              auVar78 = vfmsub231ss_fma(ZEXT416((uint)(auVar69._0_4_ * auVar74._0_4_)),
                                        local_a60._0_16_,auVar129);
              auVar74 = vinsertps_avx(auVar174,auVar129,0x1c);
              uVar62 = auVar78._0_4_;
              auVar175._4_4_ = uVar62;
              auVar175._0_4_ = uVar62;
              auVar175._8_4_ = uVar62;
              auVar175._12_4_ = uVar62;
              auVar74 = vdivps_avx(auVar74,auVar175);
              auVar78 = vinsertps_avx(local_a60._0_16_,auVar152,0x10);
              auVar78 = vdivps_avx(auVar78,auVar175);
              fVar120 = auVar195._0_4_;
              auVar130._0_4_ = fVar120 * auVar74._0_4_ + fVar121 * auVar78._0_4_;
              auVar130._4_4_ = fVar120 * auVar74._4_4_ + fVar121 * auVar78._4_4_;
              auVar130._8_4_ = fVar120 * auVar74._8_4_ + fVar121 * auVar78._8_4_;
              auVar130._12_4_ = fVar120 * auVar74._12_4_ + fVar121 * auVar78._12_4_;
              auVar9 = vsubps_avx(auVar9,auVar130);
              auVar74 = vandps_avx(auVar195,local_a00);
              if (auVar74._0_4_ < (float)local_a40._0_4_) {
                auVar195 = vfmadd231ss_fma(ZEXT416((uint)(auVar224._0_4_ + (float)local_a40._0_4_)),
                                           local_740._0_16_,ZEXT416(0x36000000));
                auVar74 = vandps_avx(ZEXT416((uint)fVar121),local_a00);
                if (auVar74._0_4_ < auVar195._0_4_) {
                  bVar65 = uVar64 < 5;
                  fVar120 = auVar9._0_4_ + (float)local_7c0._0_4_;
                  if ((ray->org).field_0.m128[3] <= fVar120) {
                    fVar121 = ray->tfar;
                    auVar224 = ZEXT3264(local_a20);
                    if (fVar120 <= fVar121) {
                      auVar9 = vmovshdup_avx(auVar9);
                      bVar55 = 0;
                      fVar122 = auVar9._0_4_;
                      if (0.0 <= fVar122) {
                        if (fVar122 <= 1.0) {
                          auVar9 = vrsqrtss_avx(auVar7,auVar7);
                          fVar125 = auVar9._0_4_;
                          pGVar4 = (context->scene->geometries).items[uVar57].ptr;
                          if ((pGVar4->mask & ray->mask) == 0) {
                            bVar55 = 0;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar55 = 1, pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0))
                          {
                            fVar92 = fVar125 * 1.5 + fVar92 * -0.5 * fVar125 * fVar125 * fVar125;
                            auVar153._0_4_ = fVar92 * (float)local_7e0._0_4_;
                            auVar153._4_4_ = fVar92 * (float)local_7e0._4_4_;
                            auVar153._8_4_ = fVar92 * fStack_7d8;
                            auVar153._12_4_ = fVar92 * fStack_7d4;
                            auVar78 = vfmadd213ps_fma(auVar70,auVar153,local_960._0_16_);
                            auVar9 = vshufps_avx(auVar153,auVar153,0xc9);
                            auVar74 = vshufps_avx(local_960._0_16_,local_960._0_16_,0xc9);
                            auVar154._0_4_ = auVar153._0_4_ * auVar74._0_4_;
                            auVar154._4_4_ = auVar153._4_4_ * auVar74._4_4_;
                            auVar154._8_4_ = auVar153._8_4_ * auVar74._8_4_;
                            auVar154._12_4_ = auVar153._12_4_ * auVar74._12_4_;
                            auVar195 = vfmsub231ps_fma(auVar154,local_960._0_16_,auVar9);
                            auVar9 = vshufps_avx(auVar195,auVar195,0xc9);
                            auVar74 = vshufps_avx(auVar78,auVar78,0xc9);
                            auVar195 = vshufps_avx(auVar195,auVar195,0xd2);
                            auVar76._0_4_ = auVar78._0_4_ * auVar195._0_4_;
                            auVar76._4_4_ = auVar78._4_4_ * auVar195._4_4_;
                            auVar76._8_4_ = auVar78._8_4_ * auVar195._8_4_;
                            auVar76._12_4_ = auVar78._12_4_ * auVar195._12_4_;
                            auVar74 = vfmsub231ps_fma(auVar76,auVar9,auVar74);
                            auVar9 = vshufps_avx(auVar74,auVar74,0xe9);
                            local_940 = vmovlps_avx(auVar9);
                            local_938 = auVar74._0_4_;
                            local_930 = 0;
                            local_92c = (undefined4)local_908;
                            local_924 = context->user->instID[0];
                            local_920 = context->user->instPrimID[0];
                            ray->tfar = fVar120;
                            local_640._0_4_ = 0xffffffff;
                            local_9b0.valid = (int *)local_640;
                            local_9b0.geometryUserPtr = pGVar4->userPtr;
                            local_9b0.context = context->user;
                            local_9b0.hit = (RTCHitN *)&local_940;
                            local_9b0.N = 1;
                            local_9b0.ray = (RTCRayN *)ray;
                            local_934 = fVar122;
                            local_928 = uVar57;
                            if (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01191560:
                              p_Var5 = context->args->filter;
                              if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar242 = ZEXT1664(auVar242._0_16_);
                                (*p_Var5)(&local_9b0);
                                if (*local_9b0.valid == 0) goto LAB_011915e0;
                              }
                              bVar55 = 1;
                            }
                            else {
                              auVar242 = ZEXT1664(auVar7);
                              (*pGVar4->occlusionFilterN)(&local_9b0);
                              if (*local_9b0.valid != 0) goto LAB_01191560;
LAB_011915e0:
                              ray->tfar = fVar121;
                              bVar55 = 0;
                            }
                            auVar224 = ZEXT3264(local_a20);
                          }
                        }
                        goto LAB_011915af;
                      }
                    }
                  }
                  bVar55 = 0;
                  auVar224 = ZEXT3264(local_a20);
                  goto LAB_011915af;
                }
              }
              uVar64 = uVar64 + 1;
              auVar224 = ZEXT3264(local_a20);
            }
            bVar65 = false;
LAB_011915af:
            fVar92 = ray->tfar;
            auVar87._4_4_ = fVar92;
            auVar87._0_4_ = fVar92;
            auVar87._8_4_ = fVar92;
            auVar87._12_4_ = fVar92;
            auVar87._16_4_ = fVar92;
            auVar87._20_4_ = fVar92;
            auVar87._24_4_ = fVar92;
            auVar87._28_4_ = fVar92;
            bVar63 = bVar63 | bVar65 & bVar55;
            auVar108 = vcmpps_avx(_local_780,auVar87,2);
            auVar108 = vandps_avx(auVar108,local_420);
            auVar230 = ZEXT3264(_local_760);
          }
          auVar259 = ZEXT3264(auVar224._0_32_);
          auVar88._0_4_ = auVar230._0_4_ + (float)local_660._0_4_;
          auVar88._4_4_ = auVar230._4_4_ + (float)local_660._4_4_;
          auVar88._8_4_ = auVar230._8_4_ + fStack_658;
          auVar88._12_4_ = auVar230._12_4_ + fStack_654;
          auVar88._16_4_ = auVar230._16_4_ + fStack_650;
          auVar88._20_4_ = auVar230._20_4_ + fStack_64c;
          auVar88._24_4_ = auVar230._24_4_ + fStack_648;
          auVar88._28_4_ = auVar230._28_4_ + fStack_644;
          fVar120 = ray->tfar;
          fVar92 = ray->tfar;
          auVar140._4_4_ = fVar92;
          auVar140._0_4_ = fVar92;
          auVar140._8_4_ = fVar92;
          auVar140._12_4_ = fVar92;
          auVar140._16_4_ = fVar92;
          auVar140._20_4_ = fVar92;
          auVar140._24_4_ = fVar92;
          auVar140._28_4_ = fVar92;
          auVar108 = vcmpps_avx(auVar88,auVar140,2);
          _local_780 = vandps_avx(auVar108,local_7a0);
          auVar89._8_4_ = 3;
          auVar89._0_8_ = 0x300000003;
          auVar89._12_4_ = 3;
          auVar89._16_4_ = 3;
          auVar89._20_4_ = 3;
          auVar89._24_4_ = 3;
          auVar89._28_4_ = 3;
          auVar141._8_4_ = 2;
          auVar141._0_8_ = 0x200000002;
          auVar141._12_4_ = 2;
          auVar141._16_4_ = 2;
          auVar141._20_4_ = 2;
          auVar141._24_4_ = 2;
          auVar141._28_4_ = 2;
          auVar108 = vblendvps_avx(auVar141,auVar89,local_5c0);
          local_7a0 = vpcmpgtd_avx2(auVar108,local_5e0);
          local_640 = vpandn_avx2(local_7a0,_local_780);
          local_880 = _local_500;
          local_760._4_4_ = (float)local_660._4_4_ + (float)local_500._4_4_;
          local_760._0_4_ = (float)local_660._0_4_ + (float)local_500._0_4_;
          fStack_758 = fStack_658 + fStack_4f8;
          fStack_754 = fStack_654 + fStack_4f4;
          fStack_750 = fStack_650 + fStack_4f0;
          fStack_74c = fStack_64c + fStack_4ec;
          fStack_748 = fStack_648 + fStack_4e8;
          fStack_744 = fStack_644 + fStack_4e4;
          auVar224 = ZEXT3264(local_8c0);
          auVar240 = ZEXT3264(local_8e0);
          for (; (((((((local_640 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (local_640 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_640 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(local_640 >> 0x7f,0) != '\0') ||
                   (local_640 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(local_640 >> 0xbf,0) != '\0') ||
                 (local_640 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 local_640[0x1f] < '\0'; local_640 = vandps_avx(auVar108,local_640)) {
            auVar119._8_4_ = 0x7f800000;
            auVar119._0_8_ = 0x7f8000007f800000;
            auVar119._12_4_ = 0x7f800000;
            auVar119._16_4_ = 0x7f800000;
            auVar119._20_4_ = 0x7f800000;
            auVar119._24_4_ = 0x7f800000;
            auVar119._28_4_ = 0x7f800000;
            auVar108 = vblendvps_avx(auVar119,local_880,local_640);
            auVar219 = vshufps_avx(auVar108,auVar108,0xb1);
            auVar219 = vminps_avx(auVar108,auVar219);
            auVar233 = vshufpd_avx(auVar219,auVar219,5);
            auVar219 = vminps_avx(auVar219,auVar233);
            auVar233 = vpermpd_avx2(auVar219,0x4e);
            auVar219 = vminps_avx(auVar219,auVar233);
            auVar219 = vcmpps_avx(auVar108,auVar219,0);
            auVar233 = local_640 & auVar219;
            auVar108 = local_640;
            if ((((((((auVar233 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar233 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar233 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar233 >> 0x7f,0) != '\0') ||
                  (auVar233 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar233 >> 0xbf,0) != '\0') ||
                (auVar233 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar233[0x1f] < '\0') {
              auVar108 = vandps_avx(auVar219,local_640);
            }
            uVar56 = vmovmskps_avx(auVar108);
            iVar13 = 0;
            for (; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x80000000) {
              iVar13 = iVar13 + 1;
            }
            uVar61 = (ulong)(uint)(iVar13 << 2);
            *(undefined4 *)(local_640 + uVar61) = 0;
            aVar1 = (ray->dir).field_0;
            local_860._0_16_ = (undefined1  [16])aVar1;
            auVar9 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            uVar56 = *(uint *)(local_1c0 + uVar61);
            uVar60 = *(uint *)(local_4e0 + uVar61);
            if (auVar9._0_4_ < 0.0) {
              auVar230 = ZEXT1664(auVar230._0_16_);
              auVar242 = ZEXT1664(auVar242._0_16_);
              fVar92 = sqrtf(auVar9._0_4_);
              auVar259 = ZEXT3264(local_a20);
              auVar240 = ZEXT3264(local_8e0);
              auVar224 = ZEXT3264(local_8c0);
              uVar61 = extraout_RAX_03;
            }
            else {
              auVar9 = vsqrtss_avx(auVar9,auVar9);
              fVar92 = auVar9._0_4_;
            }
            auVar7 = vminps_avx(local_9c0,local_9e0);
            auVar9 = vmaxps_avx(local_9c0,local_9e0);
            auVar74 = vminps_avx(local_9d0,_local_9f0);
            auVar195 = vminps_avx(auVar7,auVar74);
            auVar7 = vmaxps_avx(local_9d0,_local_9f0);
            auVar74 = vmaxps_avx(auVar9,auVar7);
            auVar9 = vandps_avx(auVar195,local_a00);
            auVar7 = vandps_avx(auVar74,local_a00);
            auVar9 = vmaxps_avx(auVar9,auVar7);
            auVar7 = vmovshdup_avx(auVar9);
            auVar7 = vmaxss_avx(auVar7,auVar9);
            auVar9 = vshufpd_avx(auVar9,auVar9,1);
            auVar9 = vmaxss_avx(auVar9,auVar7);
            local_8a0._0_4_ = auVar9._0_4_ * 1.9073486e-06;
            local_820._0_4_ = fVar92 * 1.9073486e-06;
            local_740._0_16_ = vshufps_avx(auVar74,auVar74,0xff);
            auVar9 = vinsertps_avx(ZEXT416(uVar60),ZEXT416(uVar56),0x10);
            uVar64 = 0;
            while( true ) {
              bVar55 = (byte)uVar61;
              if (uVar64 == 5) break;
              local_960._0_16_ = vmovshdup_avx(auVar9);
              fVar125 = 1.0 - local_960._0_4_;
              auVar7 = vshufps_avx(auVar9,auVar9,0x55);
              fVar92 = auVar7._0_4_;
              auVar102._0_4_ = local_9e0._0_4_ * fVar92;
              fVar120 = auVar7._4_4_;
              auVar102._4_4_ = local_9e0._4_4_ * fVar120;
              fVar121 = auVar7._8_4_;
              auVar102._8_4_ = local_9e0._8_4_ * fVar121;
              fVar122 = auVar7._12_4_;
              auVar102._12_4_ = local_9e0._12_4_ * fVar122;
              auVar131._4_4_ = fVar125;
              auVar131._0_4_ = fVar125;
              auVar131._8_4_ = fVar125;
              auVar131._12_4_ = fVar125;
              auVar7 = vfmadd231ps_fma(auVar102,auVar131,local_9c0);
              auVar155._0_4_ = local_9d0._0_4_ * fVar92;
              auVar155._4_4_ = local_9d0._4_4_ * fVar120;
              auVar155._8_4_ = local_9d0._8_4_ * fVar121;
              auVar155._12_4_ = local_9d0._12_4_ * fVar122;
              auVar74 = vfmadd231ps_fma(auVar155,auVar131,local_9e0);
              auVar197._0_4_ = fVar92 * auVar74._0_4_;
              auVar197._4_4_ = fVar120 * auVar74._4_4_;
              auVar197._8_4_ = fVar121 * auVar74._8_4_;
              auVar197._12_4_ = fVar122 * auVar74._12_4_;
              auVar195 = vfmadd231ps_fma(auVar197,auVar131,auVar7);
              auVar103._0_4_ = fVar92 * (float)local_9f0._0_4_;
              auVar103._4_4_ = fVar120 * (float)local_9f0._4_4_;
              auVar103._8_4_ = fVar121 * fStack_9e8;
              auVar103._12_4_ = fVar122 * fStack_9e4;
              auVar7 = vfmadd231ps_fma(auVar103,auVar131,local_9d0);
              auVar176._0_4_ = fVar92 * auVar7._0_4_;
              auVar176._4_4_ = fVar120 * auVar7._4_4_;
              auVar176._8_4_ = fVar121 * auVar7._8_4_;
              auVar176._12_4_ = fVar122 * auVar7._12_4_;
              auVar74 = vfmadd231ps_fma(auVar176,auVar131,auVar74);
              fVar123 = auVar9._0_4_;
              auVar104._4_4_ = fVar123;
              auVar104._0_4_ = fVar123;
              auVar104._8_4_ = fVar123;
              auVar104._12_4_ = fVar123;
              auVar7 = vfmadd213ps_fma(auVar104,local_860._0_16_,_DAT_01f45a50);
              auVar77._0_4_ = fVar92 * auVar74._0_4_;
              auVar77._4_4_ = fVar120 * auVar74._4_4_;
              auVar77._8_4_ = fVar121 * auVar74._8_4_;
              auVar77._12_4_ = fVar122 * auVar74._12_4_;
              auVar78 = vfmadd231ps_fma(auVar77,auVar195,auVar131);
              local_6c0._0_16_ = auVar78;
              auVar7 = vsubps_avx(auVar7,auVar78);
              _local_7e0 = auVar7;
              auVar7 = vdpps_avx(auVar7,auVar7,0x7f);
              fVar92 = auVar7._0_4_;
              if (fVar92 < 0.0) {
                local_980._0_16_ = ZEXT416((uint)fVar125);
                local_a40._0_16_ = auVar195;
                local_a60._0_16_ = auVar74;
                auVar230._0_4_ = sqrtf(fVar92);
                auVar230._4_60_ = extraout_var_00;
                auVar78 = auVar230._0_16_;
                uVar61 = extraout_RAX_04;
                auVar74 = local_a60._0_16_;
                auVar195 = local_a40._0_16_;
                auVar70 = local_980._0_16_;
              }
              else {
                auVar78 = vsqrtss_avx(auVar7,auVar7);
                auVar70 = ZEXT416((uint)fVar125);
              }
              auVar74 = vsubps_avx(auVar74,auVar195);
              auVar210._0_4_ = auVar74._0_4_ * 3.0;
              auVar210._4_4_ = auVar74._4_4_ * 3.0;
              auVar210._8_4_ = auVar74._8_4_ * 3.0;
              auVar210._12_4_ = auVar74._12_4_ * 3.0;
              auVar74 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar70,local_960._0_16_);
              auVar195 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_960._0_16_,auVar70);
              fVar120 = auVar70._0_4_ * 6.0;
              fVar121 = auVar74._0_4_ * 6.0;
              fVar122 = auVar195._0_4_ * 6.0;
              fVar125 = local_960._0_4_ * 6.0;
              auVar156._0_4_ = fVar125 * (float)local_9f0._0_4_;
              auVar156._4_4_ = fVar125 * (float)local_9f0._4_4_;
              auVar156._8_4_ = fVar125 * fStack_9e8;
              auVar156._12_4_ = fVar125 * fStack_9e4;
              auVar105._4_4_ = fVar122;
              auVar105._0_4_ = fVar122;
              auVar105._8_4_ = fVar122;
              auVar105._12_4_ = fVar122;
              auVar74 = vfmadd132ps_fma(auVar105,auVar156,local_9d0);
              auVar157._4_4_ = fVar121;
              auVar157._0_4_ = fVar121;
              auVar157._8_4_ = fVar121;
              auVar157._12_4_ = fVar121;
              auVar74 = vfmadd132ps_fma(auVar157,auVar74,local_9e0);
              auVar195 = vdpps_avx(auVar210,auVar210,0x7f);
              auVar106._4_4_ = fVar120;
              auVar106._0_4_ = fVar120;
              auVar106._8_4_ = fVar120;
              auVar106._12_4_ = fVar120;
              auVar69 = vfmadd132ps_fma(auVar106,auVar74,local_9c0);
              auVar74 = vblendps_avx(auVar195,_DAT_01f45a50,0xe);
              auVar70 = vrsqrtss_avx(auVar74,auVar74);
              fVar122 = auVar195._0_4_;
              fVar120 = auVar70._0_4_;
              auVar70 = vdpps_avx(auVar210,auVar69,0x7f);
              fVar120 = fVar120 * 1.5 + fVar122 * -0.5 * fVar120 * fVar120 * fVar120;
              auVar107._0_4_ = auVar69._0_4_ * fVar122;
              auVar107._4_4_ = auVar69._4_4_ * fVar122;
              auVar107._8_4_ = auVar69._8_4_ * fVar122;
              auVar107._12_4_ = auVar69._12_4_ * fVar122;
              fVar121 = auVar70._0_4_;
              auVar198._0_4_ = auVar210._0_4_ * fVar121;
              auVar198._4_4_ = auVar210._4_4_ * fVar121;
              auVar198._8_4_ = auVar210._8_4_ * fVar121;
              auVar198._12_4_ = auVar210._12_4_ * fVar121;
              auVar70 = vsubps_avx(auVar107,auVar198);
              auVar74 = vrcpss_avx(auVar74,auVar74);
              auVar69 = vfnmadd213ss_fma(auVar74,auVar195,ZEXT416(0x40000000));
              fVar121 = auVar74._0_4_ * auVar69._0_4_;
              auVar74 = vmaxss_avx(ZEXT416((uint)local_8a0._0_4_),
                                   ZEXT416((uint)(fVar123 * (float)local_820._0_4_)));
              uVar48 = CONCAT44(auVar210._4_4_,auVar210._0_4_);
              auVar232._0_8_ = uVar48 ^ 0x8000000080000000;
              auVar232._8_4_ = -auVar210._8_4_;
              auVar232._12_4_ = -auVar210._12_4_;
              auVar158._0_4_ = fVar120 * auVar70._0_4_ * fVar121;
              auVar158._4_4_ = fVar120 * auVar70._4_4_ * fVar121;
              auVar158._8_4_ = fVar120 * auVar70._8_4_ * fVar121;
              auVar158._12_4_ = fVar120 * auVar70._12_4_ * fVar121;
              local_800._0_4_ = auVar210._0_4_ * fVar120;
              local_800._4_4_ = auVar210._4_4_ * fVar120;
              local_800._8_4_ = auVar210._8_4_ * fVar120;
              local_800._12_4_ = auVar210._12_4_ * fVar120;
              local_960._0_16_ = auVar210;
              local_980._0_4_ = auVar74._0_4_;
              if (fVar122 < -fVar122) {
                local_a40._0_4_ = auVar78._0_4_;
                local_a60._0_16_ = auVar232;
                local_900._0_16_ = auVar158;
                fVar120 = sqrtf(fVar122);
                auVar78 = ZEXT416((uint)local_a40._0_4_);
                auVar74 = ZEXT416((uint)local_980._0_4_);
                uVar61 = extraout_RAX_05;
                auVar158 = local_900._0_16_;
                auVar232 = local_a60._0_16_;
              }
              else {
                auVar195 = vsqrtss_avx(auVar195,auVar195);
                fVar120 = auVar195._0_4_;
              }
              local_a40._0_16_ = vdpps_avx(_local_7e0,local_800._0_16_,0x7f);
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)local_8a0._0_4_),auVar78,auVar74);
              auVar74 = vdpps_avx(auVar232,local_800._0_16_,0x7f);
              auVar195 = vdpps_avx(_local_7e0,auVar158,0x7f);
              auVar70 = vdpps_avx(local_860._0_16_,local_800._0_16_,0x7f);
              auVar78 = vfmadd213ss_fma(ZEXT416((uint)(auVar78._0_4_ + 1.0)),
                                        ZEXT416((uint)((float)local_8a0._0_4_ / fVar120)),auVar69);
              local_a60._0_4_ = auVar78._0_4_;
              auVar79._0_4_ = local_a40._0_4_ * local_a40._0_4_;
              auVar79._4_4_ = local_a40._4_4_ * local_a40._4_4_;
              auVar79._8_4_ = local_a40._8_4_ * local_a40._8_4_;
              auVar79._12_4_ = local_a40._12_4_ * local_a40._12_4_;
              auVar78 = vdpps_avx(_local_7e0,auVar232,0x7f);
              auVar129 = vsubps_avx(auVar7,auVar79);
              auVar69 = vrsqrtss_avx(auVar129,auVar129);
              fVar121 = auVar129._0_4_;
              fVar120 = auVar69._0_4_;
              fVar120 = fVar120 * 1.5 + fVar121 * -0.5 * fVar120 * fVar120 * fVar120;
              auVar69 = vdpps_avx(_local_7e0,local_860._0_16_,0x7f);
              local_800._0_16_ = ZEXT416((uint)(auVar74._0_4_ + auVar195._0_4_));
              auVar74 = vfnmadd231ss_fma(auVar78,local_a40._0_16_,local_800._0_16_);
              auVar195 = vfnmadd231ss_fma(auVar69,local_a40._0_16_,auVar70);
              if (fVar121 < 0.0) {
                local_900._0_16_ = auVar70;
                local_6e0._0_16_ = auVar74;
                local_700._0_4_ = fVar120;
                local_720._0_16_ = auVar195;
                fVar121 = sqrtf(fVar121);
                uVar61 = extraout_RAX_06;
                fVar120 = (float)local_700._0_4_;
                auVar195 = local_720._0_16_;
                auVar70 = local_900._0_16_;
                auVar74 = local_6e0._0_16_;
              }
              else {
                auVar78 = vsqrtss_avx(auVar129,auVar129);
                fVar121 = auVar78._0_4_;
              }
              auVar242 = ZEXT1664(auVar7);
              auVar224 = ZEXT3264(local_8c0);
              auVar240 = ZEXT3264(local_8e0);
              auVar259 = ZEXT3264(local_a20);
              auVar230 = ZEXT1664(local_960._0_16_);
              auVar78 = vpermilps_avx(local_6c0._0_16_,0xff);
              fVar121 = fVar121 - auVar78._0_4_;
              auVar78 = vshufps_avx(local_960._0_16_,local_960._0_16_,0xff);
              auVar74 = vfmsub213ss_fma(auVar74,ZEXT416((uint)fVar120),auVar78);
              auVar159._0_8_ = auVar70._0_8_ ^ 0x8000000080000000;
              auVar159._8_4_ = auVar70._8_4_ ^ 0x80000000;
              auVar159._12_4_ = auVar70._12_4_ ^ 0x80000000;
              auVar177._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
              auVar177._8_4_ = auVar74._8_4_ ^ 0x80000000;
              auVar177._12_4_ = auVar74._12_4_ ^ 0x80000000;
              auVar69 = ZEXT416((uint)(auVar195._0_4_ * fVar120));
              auVar195 = vfmsub231ss_fma(ZEXT416((uint)(auVar74._0_4_ * auVar70._0_4_)),
                                         local_800._0_16_,auVar69);
              auVar74 = vinsertps_avx(auVar177,auVar69,0x1c);
              uVar62 = auVar195._0_4_;
              auVar178._4_4_ = uVar62;
              auVar178._0_4_ = uVar62;
              auVar178._8_4_ = uVar62;
              auVar178._12_4_ = uVar62;
              auVar74 = vdivps_avx(auVar74,auVar178);
              auVar195 = vinsertps_avx(local_800._0_16_,auVar159,0x10);
              auVar195 = vdivps_avx(auVar195,auVar178);
              fVar120 = local_a40._0_4_;
              auVar132._0_4_ = fVar120 * auVar74._0_4_ + fVar121 * auVar195._0_4_;
              auVar132._4_4_ = fVar120 * auVar74._4_4_ + fVar121 * auVar195._4_4_;
              auVar132._8_4_ = fVar120 * auVar74._8_4_ + fVar121 * auVar195._8_4_;
              auVar132._12_4_ = fVar120 * auVar74._12_4_ + fVar121 * auVar195._12_4_;
              auVar9 = vsubps_avx(auVar9,auVar132);
              auVar74 = vandps_avx(local_a40._0_16_,local_a00);
              if (auVar74._0_4_ < (float)local_a60._0_4_) {
                auVar195 = vfmadd231ss_fma(ZEXT416((uint)((float)local_a60._0_4_ +
                                                         (float)local_980._0_4_)),local_740._0_16_,
                                           ZEXT416(0x36000000));
                auVar74 = vandps_avx(ZEXT416((uint)fVar121),local_a00);
                if (auVar74._0_4_ < auVar195._0_4_) {
                  bVar65 = uVar64 < 5;
                  fVar120 = auVar9._0_4_ + (float)local_7c0._0_4_;
                  bVar55 = 0;
                  if (((ray->org).field_0.m128[3] <= fVar120) &&
                     (fVar121 = ray->tfar, fVar120 <= fVar121)) {
                    auVar9 = vmovshdup_avx(auVar9);
                    fVar122 = auVar9._0_4_;
                    bVar55 = 0;
                    if ((0.0 <= fVar122) && (bVar55 = 0, fVar122 <= 1.0)) {
                      auVar9 = vrsqrtss_avx(auVar7,auVar7);
                      fVar125 = auVar9._0_4_;
                      pGVar4 = (context->scene->geometries).items[uVar57].ptr;
                      if ((pGVar4->mask & ray->mask) == 0) {
                        bVar55 = 0;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (bVar55 = 1, pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        fVar92 = fVar125 * 1.5 + fVar92 * -0.5 * fVar125 * fVar125 * fVar125;
                        auVar160._0_4_ = fVar92 * (float)local_7e0._0_4_;
                        auVar160._4_4_ = fVar92 * (float)local_7e0._4_4_;
                        auVar160._8_4_ = fVar92 * fStack_7d8;
                        auVar160._12_4_ = fVar92 * fStack_7d4;
                        auVar78 = vfmadd213ps_fma(auVar78,auVar160,local_960._0_16_);
                        auVar9 = vshufps_avx(auVar160,auVar160,0xc9);
                        auVar74 = vshufps_avx(local_960._0_16_,local_960._0_16_,0xc9);
                        auVar161._0_4_ = auVar160._0_4_ * auVar74._0_4_;
                        auVar161._4_4_ = auVar160._4_4_ * auVar74._4_4_;
                        auVar161._8_4_ = auVar160._8_4_ * auVar74._8_4_;
                        auVar161._12_4_ = auVar160._12_4_ * auVar74._12_4_;
                        auVar195 = vfmsub231ps_fma(auVar161,local_960._0_16_,auVar9);
                        auVar9 = vshufps_avx(auVar195,auVar195,0xc9);
                        auVar74 = vshufps_avx(auVar78,auVar78,0xc9);
                        auVar195 = vshufps_avx(auVar195,auVar195,0xd2);
                        auVar80._0_4_ = auVar78._0_4_ * auVar195._0_4_;
                        auVar80._4_4_ = auVar78._4_4_ * auVar195._4_4_;
                        auVar80._8_4_ = auVar78._8_4_ * auVar195._8_4_;
                        auVar80._12_4_ = auVar78._12_4_ * auVar195._12_4_;
                        auVar74 = vfmsub231ps_fma(auVar80,auVar9,auVar74);
                        auVar9 = vshufps_avx(auVar74,auVar74,0xe9);
                        local_940 = vmovlps_avx(auVar9);
                        local_938 = auVar74._0_4_;
                        local_930 = 0;
                        local_92c = (undefined4)local_908;
                        local_924 = context->user->instID[0];
                        local_920 = context->user->instPrimID[0];
                        ray->tfar = fVar120;
                        local_a64 = -1;
                        local_9b0.valid = &local_a64;
                        local_9b0.geometryUserPtr = pGVar4->userPtr;
                        local_9b0.context = context->user;
                        local_9b0.hit = (RTCHitN *)&local_940;
                        local_9b0.N = 1;
                        local_9b0.ray = (RTCRayN *)ray;
                        local_934 = fVar122;
                        local_928 = uVar57;
                        if (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01191ee5:
                          p_Var5 = context->args->filter;
                          if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar230 = ZEXT1664(auVar230._0_16_);
                            auVar242 = ZEXT1664(auVar242._0_16_);
                            (*p_Var5)(&local_9b0);
                            if (*local_9b0.valid == 0) goto LAB_01191f2e;
                          }
                          bVar55 = 1;
                        }
                        else {
                          auVar230 = ZEXT1664(local_960._0_16_);
                          auVar242 = ZEXT1664(auVar7);
                          (*pGVar4->occlusionFilterN)(&local_9b0);
                          if (*local_9b0.valid != 0) goto LAB_01191ee5;
LAB_01191f2e:
                          ray->tfar = fVar121;
                          bVar55 = 0;
                        }
                        auVar224 = ZEXT3264(local_8c0);
                        auVar240 = ZEXT3264(local_8e0);
                        auVar259 = ZEXT3264(local_a20);
                      }
                    }
                  }
                  goto LAB_01191ceb;
                }
              }
              uVar64 = uVar64 + 1;
            }
            bVar65 = false;
LAB_01191ceb:
            bVar63 = bVar63 | bVar65 & bVar55;
            fVar92 = ray->tfar;
            auVar90._4_4_ = fVar92;
            auVar90._0_4_ = fVar92;
            auVar90._8_4_ = fVar92;
            auVar90._12_4_ = fVar92;
            auVar90._16_4_ = fVar92;
            auVar90._20_4_ = fVar92;
            auVar90._24_4_ = fVar92;
            auVar90._28_4_ = fVar92;
            fVar120 = ray->tfar;
            auVar108 = vcmpps_avx(_local_760,auVar90,2);
          }
          auVar142._0_4_ = (float)local_660._0_4_ + local_4c0._0_4_;
          auVar142._4_4_ = (float)local_660._4_4_ + local_4c0._4_4_;
          auVar142._8_4_ = fStack_658 + local_4c0._8_4_;
          auVar142._12_4_ = fStack_654 + local_4c0._12_4_;
          auVar142._16_4_ = fStack_650 + local_4c0._16_4_;
          auVar142._20_4_ = fStack_64c + local_4c0._20_4_;
          auVar142._24_4_ = fStack_648 + local_4c0._24_4_;
          auVar142._28_4_ = fStack_644 + local_4c0._28_4_;
          auVar167._4_4_ = fVar120;
          auVar167._0_4_ = fVar120;
          auVar167._8_4_ = fVar120;
          auVar167._12_4_ = fVar120;
          auVar167._16_4_ = fVar120;
          auVar167._20_4_ = fVar120;
          auVar167._24_4_ = fVar120;
          auVar167._28_4_ = fVar120;
          auVar219 = vcmpps_avx(auVar142,auVar167,2);
          auVar108 = vandps_avx(local_5a0,local_580);
          auVar108 = vandps_avx(auVar219,auVar108);
          auVar187._0_4_ = (float)local_660._0_4_ + local_500._0_4_;
          auVar187._4_4_ = (float)local_660._4_4_ + local_500._4_4_;
          auVar187._8_4_ = fStack_658 + local_500._8_4_;
          auVar187._12_4_ = fStack_654 + local_500._12_4_;
          auVar187._16_4_ = fStack_650 + local_500._16_4_;
          auVar187._20_4_ = fStack_64c + local_500._20_4_;
          auVar187._24_4_ = fStack_648 + local_500._24_4_;
          auVar187._28_4_ = fStack_644 + local_500._28_4_;
          auVar233 = vcmpps_avx(auVar187,auVar167,2);
          auVar219 = vandps_avx(local_7a0,_local_780);
          auVar219 = vandps_avx(auVar233,auVar219);
          auVar219 = vorps_avx(auVar108,auVar219);
          if ((((((((auVar219 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar219 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar219 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar219 >> 0x7f,0) != '\0') ||
                (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar219 >> 0xbf,0) != '\0') ||
              (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar219[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar58 * 0x60) = auVar219;
            auVar108 = vblendvps_avx(_local_500,local_4c0,auVar108);
            *(undefined1 (*) [32])(auStack_160 + uVar58 * 0x60) = auVar108;
            uVar61 = vmovlps_avx(local_510);
            (&uStack_140)[uVar58 * 0xc] = uVar61;
            aiStack_138[uVar58 * 0x18] = local_b04 + 1;
            uVar58 = (ulong)((int)uVar58 + 1);
          }
          auVar224 = ZEXT3264(auVar224._0_32_);
          auVar249 = ZEXT3264(auVar240._0_32_);
          auVar265 = ZEXT3264(auVar259._0_32_);
          auVar259 = ZEXT3264(local_840);
          goto LAB_01190b37;
        }
      }
      auVar259 = ZEXT3264(local_840);
      auVar265 = ZEXT3264(local_a20);
      auVar249 = ZEXT3264(local_8e0);
      auVar224 = ZEXT3264(local_8c0);
    }
LAB_01190b37:
    auVar219 = local_360;
    fVar120 = ray->tfar;
    fVar92 = ray->tfar;
    auVar138._4_4_ = fVar92;
    auVar138._0_4_ = fVar92;
    auVar138._8_4_ = fVar92;
    auVar138._12_4_ = fVar92;
    auVar138._16_4_ = fVar92;
    auVar138._20_4_ = fVar92;
    auVar138._24_4_ = fVar92;
    auVar138._28_4_ = fVar92;
    while( true ) {
      uVar56 = (uint)uVar58;
      if (uVar56 == 0) {
        if (bVar63 != 0) goto LAB_0119213c;
        auVar81._4_4_ = fVar120;
        auVar81._0_4_ = fVar120;
        auVar81._8_4_ = fVar120;
        auVar81._12_4_ = fVar120;
        auVar9 = vcmpps_avx(local_520,auVar81,2);
        uVar57 = vmovmskps_avx(auVar9);
        local_7a8 = (ulong)((uint)local_7b0 & uVar57);
        goto LAB_0118fc85;
      }
      uVar58 = (ulong)(uVar56 - 1);
      lVar59 = uVar58 * 0x60;
      auVar108 = *(undefined1 (*) [32])(auStack_160 + lVar59);
      auVar115._0_4_ = auVar108._0_4_ + (float)local_660._0_4_;
      auVar115._4_4_ = auVar108._4_4_ + (float)local_660._4_4_;
      auVar115._8_4_ = auVar108._8_4_ + fStack_658;
      auVar115._12_4_ = auVar108._12_4_ + fStack_654;
      auVar115._16_4_ = auVar108._16_4_ + fStack_650;
      auVar115._20_4_ = auVar108._20_4_ + fStack_64c;
      auVar115._24_4_ = auVar108._24_4_ + fStack_648;
      auVar115._28_4_ = auVar108._28_4_ + fStack_644;
      auVar114 = vcmpps_avx(auVar115,auVar138,2);
      auVar233 = vandps_avx(auVar114,*(undefined1 (*) [32])(auStack_180 + lVar59));
      local_4c0 = auVar233;
      auVar114 = *(undefined1 (*) [32])(auStack_180 + lVar59) & auVar114;
      if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar114 >> 0x7f,0) != '\0') ||
            (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar114 >> 0xbf,0) != '\0') ||
          (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar114[0x1f] < '\0') break;
      uVar58 = (ulong)(uVar56 - 1);
    }
    auVar84._8_4_ = 0x7f800000;
    auVar84._0_8_ = 0x7f8000007f800000;
    auVar84._12_4_ = 0x7f800000;
    auVar84._16_4_ = 0x7f800000;
    auVar84._20_4_ = 0x7f800000;
    auVar84._24_4_ = 0x7f800000;
    auVar84._28_4_ = 0x7f800000;
    auVar108 = vblendvps_avx(auVar84,auVar108,auVar233);
    auVar114 = vshufps_avx(auVar108,auVar108,0xb1);
    auVar114 = vminps_avx(auVar108,auVar114);
    auVar113 = vshufpd_avx(auVar114,auVar114,5);
    auVar114 = vminps_avx(auVar114,auVar113);
    auVar113 = vpermpd_avx2(auVar114,0x4e);
    auVar114 = vminps_avx(auVar114,auVar113);
    auVar108 = vcmpps_avx(auVar108,auVar114,0);
    auVar114 = auVar233 & auVar108;
    if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar114 >> 0x7f,0) != '\0') ||
          (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar114 >> 0xbf,0) != '\0') ||
        (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar114[0x1f] < '\0') {
      auVar233 = vandps_avx(auVar108,auVar233);
    }
    uVar60 = vmovmskps_avx(auVar233);
    iVar13 = 0;
    for (; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x80000000) {
      iVar13 = iVar13 + 1;
    }
    *(undefined4 *)(local_4c0 + (uint)(iVar13 << 2)) = 0;
    uVar61 = (&uStack_140)[uVar58 * 0xc];
    auVar72._8_8_ = 0;
    auVar72._0_8_ = uVar61;
    local_b04 = aiStack_138[uVar58 * 0x18];
    *(undefined1 (*) [32])(auStack_180 + lVar59) = local_4c0;
    uVar60 = uVar56 - 1;
    if ((((((((local_4c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_4c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_4c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_4c0 >> 0x7f,0) != '\0') ||
          (local_4c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_4c0 >> 0xbf,0) != '\0') ||
        (local_4c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_4c0[0x1f] < '\0') {
      uVar60 = uVar56;
    }
    uVar62 = (undefined4)uVar61;
    auVar116._4_4_ = uVar62;
    auVar116._0_4_ = uVar62;
    auVar116._8_4_ = uVar62;
    auVar116._12_4_ = uVar62;
    auVar116._16_4_ = uVar62;
    auVar116._20_4_ = uVar62;
    auVar116._24_4_ = uVar62;
    auVar116._28_4_ = uVar62;
    auVar9 = vmovshdup_avx(auVar72);
    auVar9 = vsubps_avx(auVar9,auVar72);
    auVar85._0_4_ = auVar9._0_4_;
    auVar85._4_4_ = auVar85._0_4_;
    auVar85._8_4_ = auVar85._0_4_;
    auVar85._12_4_ = auVar85._0_4_;
    auVar85._16_4_ = auVar85._0_4_;
    auVar85._20_4_ = auVar85._0_4_;
    auVar85._24_4_ = auVar85._0_4_;
    auVar85._28_4_ = auVar85._0_4_;
    auVar9 = vfmadd132ps_fma(auVar85,auVar116,_DAT_01f7b040);
    _local_500 = ZEXT1632(auVar9);
    local_510._8_8_ = 0;
    local_510._0_8_ = *(ulong *)(local_500 + (uint)(iVar13 << 2));
    uVar58 = (ulong)uVar60;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }